

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::sse2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive *pPVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  int iVar45;
  undefined4 uVar46;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  RayK<4> *pRVar47;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  RTCFilterFunctionN p_Var48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  byte unaff_BL;
  byte bVar52;
  int iVar53;
  undefined4 uVar54;
  long lVar55;
  RTCFilterFunctionNArguments *pRVar57;
  long lVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  short sVar67;
  float fVar68;
  float fVar69;
  float fVar112;
  float fVar114;
  __m128 a_1;
  undefined2 uVar111;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  float fVar113;
  float fVar115;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 extraout_var [12];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar116;
  float fVar137;
  float fVar138;
  vfloat4 a;
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar153;
  float fVar154;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar155;
  float fVar168;
  float fVar169;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar183;
  float fVar184;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar196;
  float fVar197;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar209;
  float fVar210;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar232;
  float fVar233;
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar240;
  float fVar241;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar243 [16];
  float fVar246;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar257;
  float fVar264;
  float fVar266;
  undefined1 auVar258 [16];
  float fVar268;
  undefined1 auVar261 [16];
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar275;
  float fVar278;
  float fVar281;
  undefined1 auVar273 [16];
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  undefined1 auVar274 [16];
  float fVar284;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [16];
  undefined1 auVar291 [16];
  float fVar292;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar300;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_6b9;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined8 local_598;
  undefined8 uStack_590;
  ulong local_588;
  RTCFilterFunctionNArguments *local_580;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [4];
  float fStack_524;
  undefined8 uStack_520;
  RTCRayQueryContext *local_518;
  RayK<4> *local_510;
  RTCHitN *local_508;
  uint local_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  float local_3a8 [4];
  float local_398 [6];
  RTCFilterFunctionNArguments *local_380;
  Primitive *local_378;
  ulong local_370;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [6];
  float local_d0 [40];
  ulong uVar56;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar110;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  
  PVar6 = prim[1];
  uVar56 = (ulong)(byte)PVar6;
  pPVar2 = prim + uVar56 * 0x19 + 6;
  fVar154 = *(float *)(pPVar2 + 0xc);
  fVar170 = (*(float *)(ray + k * 4) - *(float *)pPVar2) * fVar154;
  fVar183 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar2 + 4)) * fVar154;
  fVar184 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar2 + 8)) * fVar154;
  fVar139 = *(float *)(ray + k * 4 + 0x40) * fVar154;
  fVar153 = *(float *)(ray + k * 4 + 0x50) * fVar154;
  fVar154 = *(float *)(ray + k * 4 + 0x60) * fVar154;
  uVar54 = *(undefined4 *)(prim + uVar56 * 4 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar51;
  auVar189._12_2_ = uVar111;
  auVar189._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar51;
  auVar188._10_2_ = uVar111;
  auVar77._10_6_ = auVar188._10_6_;
  auVar77._8_2_ = uVar111;
  auVar77._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar30._4_8_ = auVar77._8_8_;
  auVar30._2_2_ = uVar111;
  auVar30._0_2_ = uVar111;
  fVar116 = (float)((int)sVar67 >> 8);
  fVar137 = (float)(auVar30._0_4_ >> 0x18);
  fVar138 = (float)(auVar77._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 5 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar51;
  auVar70._12_2_ = uVar111;
  auVar70._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar205._12_4_ = auVar70._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar51;
  auVar205._10_2_ = uVar111;
  auVar158._10_6_ = auVar205._10_6_;
  auVar158._8_2_ = uVar111;
  auVar158._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar31._4_8_ = auVar158._8_8_;
  auVar31._2_2_ = uVar111;
  auVar31._0_2_ = uVar111;
  fVar185 = (float)((int)sVar67 >> 8);
  fVar196 = (float)(auVar31._0_4_ >> 0x18);
  fVar197 = (float)(auVar158._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 6 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar51;
  auVar73._12_2_ = uVar111;
  auVar73._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar51;
  auVar72._10_2_ = uVar111;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar111;
  auVar71._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar32._4_8_ = auVar71._8_8_;
  auVar32._2_2_ = uVar111;
  auVar32._0_2_ = uVar111;
  fVar155 = (float)((int)sVar67 >> 8);
  fVar168 = (float)(auVar32._0_4_ >> 0x18);
  fVar169 = (float)(auVar71._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar56 * 0xb + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar51;
  auVar76._12_2_ = uVar111;
  auVar76._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar51;
  auVar75._10_2_ = uVar111;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar111;
  auVar74._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar33._4_8_ = auVar74._8_8_;
  auVar33._2_2_ = uVar111;
  auVar33._0_2_ = uVar111;
  fVar68 = (float)((int)sVar67 >> 8);
  fVar112 = (float)(auVar33._0_4_ >> 0x18);
  fVar114 = (float)(auVar74._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar51;
  auVar201._12_2_ = uVar111;
  auVar201._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar51;
  auVar200._10_2_ = uVar111;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar111;
  auVar199._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar34._4_8_ = auVar199._8_8_;
  auVar34._2_2_ = uVar111;
  auVar34._0_2_ = uVar111;
  fVar198 = (float)((int)sVar67 >> 8);
  fVar209 = (float)(auVar34._0_4_ >> 0x18);
  fVar210 = (float)(auVar199._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar56 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar51;
  auVar214._12_2_ = uVar111;
  auVar214._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar51;
  auVar213._10_2_ = uVar111;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar111;
  auVar212._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar35._4_8_ = auVar212._8_8_;
  auVar35._2_2_ = uVar111;
  auVar35._0_2_ = uVar111;
  fVar242 = (float)((int)sVar67 >> 8);
  fVar244 = (float)(auVar35._0_4_ >> 0x18);
  fVar245 = (float)(auVar212._8_4_ >> 0x18);
  uVar49 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  uVar54 = *(undefined4 *)(prim + uVar49 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar51;
  auVar217._12_2_ = uVar111;
  auVar217._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar51;
  auVar216._10_2_ = uVar111;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar111;
  auVar215._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar36._4_8_ = auVar215._8_8_;
  auVar36._2_2_ = uVar111;
  auVar36._0_2_ = uVar111;
  fVar234 = (float)((int)sVar67 >> 8);
  fVar240 = (float)(auVar36._0_4_ >> 0x18);
  fVar241 = (float)(auVar215._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar49 + uVar56 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar51;
  auVar220._12_2_ = uVar111;
  auVar220._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar51;
  auVar219._10_2_ = uVar111;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar111;
  auVar218._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar37._4_8_ = auVar218._8_8_;
  auVar37._2_2_ = uVar111;
  auVar37._0_2_ = uVar111;
  fVar246 = (float)((int)sVar67 >> 8);
  fVar253 = (float)(auVar37._0_4_ >> 0x18);
  fVar254 = (float)(auVar218._8_4_ >> 0x18);
  uVar49 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  uVar54 = *(undefined4 *)(prim + uVar49 + 6);
  uVar110 = (undefined1)((uint)uVar54 >> 0x18);
  uVar111 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar54 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar111,uVar110),CONCAT14(uVar110,uVar54));
  uVar110 = (undefined1)((uint)uVar54 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar110),uVar110);
  sVar67 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar29,sVar67);
  auVar260._8_4_ = 0;
  auVar260._0_8_ = uVar51;
  auVar260._12_2_ = uVar111;
  auVar260._14_2_ = uVar111;
  uVar111 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._8_2_ = 0;
  auVar259._0_8_ = uVar51;
  auVar259._10_2_ = uVar111;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._8_2_ = uVar111;
  auVar258._0_8_ = uVar51;
  uVar111 = (undefined2)uVar29;
  auVar38._4_8_ = auVar258._8_8_;
  auVar38._2_2_ = uVar111;
  auVar38._0_2_ = uVar111;
  fVar69 = (float)((int)sVar67 >> 8);
  fVar113 = (float)(auVar38._0_4_ >> 0x18);
  fVar115 = (float)(auVar258._8_4_ >> 0x18);
  fVar270 = fVar139 * fVar116 + fVar153 * fVar185 + fVar154 * fVar155;
  fVar275 = fVar139 * fVar137 + fVar153 * fVar196 + fVar154 * fVar168;
  fVar278 = fVar139 * fVar138 + fVar153 * fVar197 + fVar154 * fVar169;
  fVar281 = fVar139 * (float)(auVar188._12_4_ >> 0x18) +
            fVar153 * (float)(auVar205._12_4_ >> 0x18) + fVar154 * (float)(auVar72._12_4_ >> 0x18);
  fVar257 = fVar139 * fVar68 + fVar153 * fVar198 + fVar154 * fVar242;
  fVar264 = fVar139 * fVar112 + fVar153 * fVar209 + fVar154 * fVar244;
  fVar266 = fVar139 * fVar114 + fVar153 * fVar210 + fVar154 * fVar245;
  fVar268 = fVar139 * (float)(auVar75._12_4_ >> 0x18) +
            fVar153 * (float)(auVar200._12_4_ >> 0x18) + fVar154 * (float)(auVar213._12_4_ >> 0x18);
  fVar211 = fVar139 * fVar234 + fVar153 * fVar246 + fVar154 * fVar69;
  fVar232 = fVar139 * fVar240 + fVar153 * fVar253 + fVar154 * fVar113;
  fVar233 = fVar139 * fVar241 + fVar153 * fVar254 + fVar154 * fVar115;
  fVar139 = fVar139 * (float)(auVar216._12_4_ >> 0x18) +
            fVar153 * (float)(auVar219._12_4_ >> 0x18) + fVar154 * (float)(auVar259._12_4_ >> 0x18);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar155 = fVar116 * fVar170 + fVar185 * fVar183 + fVar155 * fVar184;
  fVar168 = fVar137 * fVar170 + fVar196 * fVar183 + fVar168 * fVar184;
  fVar169 = fVar138 * fVar170 + fVar197 * fVar183 + fVar169 * fVar184;
  fVar185 = (float)(auVar188._12_4_ >> 0x18) * fVar170 +
            (float)(auVar205._12_4_ >> 0x18) * fVar183 + (float)(auVar72._12_4_ >> 0x18) * fVar184;
  fVar242 = fVar68 * fVar170 + fVar198 * fVar183 + fVar242 * fVar184;
  fVar209 = fVar112 * fVar170 + fVar209 * fVar183 + fVar244 * fVar184;
  fVar210 = fVar114 * fVar170 + fVar210 * fVar183 + fVar245 * fVar184;
  fVar244 = (float)(auVar75._12_4_ >> 0x18) * fVar170 +
            (float)(auVar200._12_4_ >> 0x18) * fVar183 + (float)(auVar213._12_4_ >> 0x18) * fVar184;
  fVar196 = fVar170 * fVar234 + fVar183 * fVar246 + fVar184 * fVar69;
  fVar197 = fVar170 * fVar240 + fVar183 * fVar253 + fVar184 * fVar113;
  fVar198 = fVar170 * fVar241 + fVar183 * fVar254 + fVar184 * fVar115;
  fVar170 = fVar170 * (float)(auVar216._12_4_ >> 0x18) +
            fVar183 * (float)(auVar219._12_4_ >> 0x18) + fVar184 * (float)(auVar259._12_4_ >> 0x18);
  fVar154 = (float)DAT_01ff1d40;
  fVar68 = DAT_01ff1d40._4_4_;
  fVar69 = DAT_01ff1d40._8_4_;
  fVar112 = DAT_01ff1d40._12_4_;
  uVar59 = -(uint)(fVar154 <= ABS(fVar270));
  uVar61 = -(uint)(fVar68 <= ABS(fVar275));
  uVar63 = -(uint)(fVar69 <= ABS(fVar278));
  uVar65 = -(uint)(fVar112 <= ABS(fVar281));
  auVar273._0_4_ = (uint)fVar270 & uVar59;
  auVar273._4_4_ = (uint)fVar275 & uVar61;
  auVar273._8_4_ = (uint)fVar278 & uVar63;
  auVar273._12_4_ = (uint)fVar281 & uVar65;
  auVar171._0_4_ = ~uVar59 & (uint)fVar154;
  auVar171._4_4_ = ~uVar61 & (uint)fVar68;
  auVar171._8_4_ = ~uVar63 & (uint)fVar69;
  auVar171._12_4_ = ~uVar65 & (uint)fVar112;
  auVar171 = auVar171 | auVar273;
  uVar59 = -(uint)(fVar154 <= ABS(fVar257));
  uVar61 = -(uint)(fVar68 <= ABS(fVar264));
  uVar63 = -(uint)(fVar69 <= ABS(fVar266));
  uVar65 = -(uint)(fVar112 <= ABS(fVar268));
  auVar261._0_4_ = (uint)fVar257 & uVar59;
  auVar261._4_4_ = (uint)fVar264 & uVar61;
  auVar261._8_4_ = (uint)fVar266 & uVar63;
  auVar261._12_4_ = (uint)fVar268 & uVar65;
  auVar186._0_4_ = ~uVar59 & (uint)fVar154;
  auVar186._4_4_ = ~uVar61 & (uint)fVar68;
  auVar186._8_4_ = ~uVar63 & (uint)fVar69;
  auVar186._12_4_ = ~uVar65 & (uint)fVar112;
  auVar186 = auVar186 | auVar261;
  uVar59 = -(uint)(fVar154 <= ABS(fVar211));
  uVar61 = -(uint)(fVar68 <= ABS(fVar232));
  uVar63 = -(uint)(fVar69 <= ABS(fVar233));
  uVar65 = -(uint)(fVar112 <= ABS(fVar139));
  auVar221._0_4_ = (uint)fVar211 & uVar59;
  auVar221._4_4_ = (uint)fVar232 & uVar61;
  auVar221._8_4_ = (uint)fVar233 & uVar63;
  auVar221._12_4_ = (uint)fVar139 & uVar65;
  auVar202._0_4_ = ~uVar59 & (uint)fVar154;
  auVar202._4_4_ = ~uVar61 & (uint)fVar68;
  auVar202._8_4_ = ~uVar63 & (uint)fVar69;
  auVar202._12_4_ = ~uVar65 & (uint)fVar112;
  auVar202 = auVar202 | auVar221;
  auVar77 = rcpps(_DAT_01ff1d40,auVar171);
  fVar154 = auVar77._0_4_;
  fVar112 = auVar77._4_4_;
  fVar115 = auVar77._8_4_;
  fVar138 = auVar77._12_4_;
  fVar154 = (1.0 - auVar171._0_4_ * fVar154) * fVar154 + fVar154;
  fVar112 = (1.0 - auVar171._4_4_ * fVar112) * fVar112 + fVar112;
  fVar115 = (1.0 - auVar171._8_4_ * fVar115) * fVar115 + fVar115;
  fVar138 = (1.0 - auVar171._12_4_ * fVar138) * fVar138 + fVar138;
  auVar77 = rcpps(auVar77,auVar186);
  fVar68 = auVar77._0_4_;
  fVar113 = auVar77._4_4_;
  fVar116 = auVar77._8_4_;
  fVar139 = auVar77._12_4_;
  fVar68 = (1.0 - auVar186._0_4_ * fVar68) * fVar68 + fVar68;
  fVar113 = (1.0 - auVar186._4_4_ * fVar113) * fVar113 + fVar113;
  fVar116 = (1.0 - auVar186._8_4_ * fVar116) * fVar116 + fVar116;
  fVar139 = (1.0 - auVar186._12_4_ * fVar139) * fVar139 + fVar139;
  auVar77 = rcpps(auVar77,auVar202);
  fVar69 = auVar77._0_4_;
  fVar114 = auVar77._4_4_;
  fVar137 = auVar77._8_4_;
  fVar153 = auVar77._12_4_;
  fVar69 = (1.0 - auVar202._0_4_ * fVar69) * fVar69 + fVar69;
  fVar114 = (1.0 - auVar202._4_4_ * fVar114) * fVar114 + fVar114;
  fVar137 = (1.0 - auVar202._8_4_ * fVar137) * fVar137 + fVar137;
  fVar153 = (1.0 - auVar202._12_4_ * fVar153) * fVar153 + fVar153;
  uVar51 = *(ulong *)(prim + uVar56 * 7 + 6);
  uVar111 = (undefined2)(uVar51 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar51;
  auVar80._12_2_ = uVar111;
  auVar80._14_2_ = uVar111;
  uVar111 = (undefined2)(uVar51 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar51;
  auVar79._10_2_ = uVar111;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar111;
  auVar78._0_8_ = uVar51;
  uVar111 = (undefined2)(uVar51 >> 0x10);
  auVar39._4_8_ = auVar78._8_8_;
  auVar39._2_2_ = uVar111;
  auVar39._0_2_ = uVar111;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar168) * fVar112,
                ((float)(int)(short)uVar51 - fVar155) * fVar154);
  auVar172._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar169) * fVar115;
  auVar172._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar185) * fVar138;
  uVar51 = *(ulong *)(prim + uVar56 * 9 + 6);
  uVar111 = (undefined2)(uVar51 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar51;
  auVar83._12_2_ = uVar111;
  auVar83._14_2_ = uVar111;
  uVar111 = (undefined2)(uVar51 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar51;
  auVar82._10_2_ = uVar111;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar111;
  auVar81._0_8_ = uVar51;
  uVar111 = (undefined2)(uVar51 >> 0x10);
  auVar40._4_8_ = auVar81._8_8_;
  auVar40._2_2_ = uVar111;
  auVar40._0_2_ = uVar111;
  auVar203._0_4_ = ((float)(int)(short)uVar51 - fVar155) * fVar154;
  auVar203._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar168) * fVar112;
  auVar203._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar169) * fVar115;
  auVar203._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar185) * fVar138;
  lVar50 = uVar49 + uVar56;
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar49 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar56 * -2 + 6);
  uVar111 = (undefined2)(uVar49 >> 0x30);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar49;
  auVar119._12_2_ = uVar111;
  auVar119._14_2_ = uVar111;
  uVar111 = (undefined2)(uVar49 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar49;
  auVar118._10_2_ = uVar111;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar111;
  auVar117._0_8_ = uVar49;
  uVar111 = (undefined2)(uVar49 >> 0x10);
  auVar41._4_8_ = auVar117._8_8_;
  auVar41._2_2_ = uVar111;
  auVar41._0_2_ = uVar111;
  auVar120._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar209) * fVar113,
                ((float)(int)(short)uVar49 - fVar242) * fVar68);
  auVar120._8_4_ = ((float)(auVar117._8_4_ >> 0x10) - fVar210) * fVar116;
  auVar120._12_4_ = ((float)(auVar118._12_4_ >> 0x10) - fVar244) * fVar139;
  uVar111 = (undefined2)(uVar51 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar51;
  auVar86._12_2_ = uVar111;
  auVar86._14_2_ = uVar111;
  uVar111 = (undefined2)(uVar51 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar51;
  auVar85._10_2_ = uVar111;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar111;
  auVar84._0_8_ = uVar51;
  uVar111 = (undefined2)(uVar51 >> 0x10);
  auVar42._4_8_ = auVar84._8_8_;
  auVar42._2_2_ = uVar111;
  auVar42._0_2_ = uVar111;
  auVar235._0_4_ = ((float)(int)(short)uVar51 - fVar242) * fVar68;
  auVar235._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar209) * fVar113;
  auVar235._8_4_ = ((float)(auVar84._8_4_ >> 0x10) - fVar210) * fVar116;
  auVar235._12_4_ = ((float)(auVar85._12_4_ >> 0x10) - fVar244) * fVar139;
  uVar51 = *(ulong *)(prim + lVar50 + 6);
  uVar111 = (undefined2)(uVar51 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar51;
  auVar89._12_2_ = uVar111;
  auVar89._14_2_ = uVar111;
  uVar111 = (undefined2)(uVar51 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar51;
  auVar88._10_2_ = uVar111;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar111;
  auVar87._0_8_ = uVar51;
  uVar111 = (undefined2)(uVar51 >> 0x10);
  auVar43._4_8_ = auVar87._8_8_;
  auVar43._2_2_ = uVar111;
  auVar43._0_2_ = uVar111;
  auVar90._0_8_ =
       CONCAT44(((float)(auVar43._0_4_ >> 0x10) - fVar197) * fVar114,
                ((float)(int)(short)uVar51 - fVar196) * fVar69);
  auVar90._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar198) * fVar137;
  auVar90._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar170) * fVar153;
  uVar51 = *(ulong *)(prim + uVar56 * 0x17 + 6);
  uVar111 = (undefined2)(uVar51 >> 0x30);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar51;
  auVar224._12_2_ = uVar111;
  auVar224._14_2_ = uVar111;
  uVar111 = (undefined2)(uVar51 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar51;
  auVar223._10_2_ = uVar111;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar111;
  auVar222._0_8_ = uVar51;
  uVar111 = (undefined2)(uVar51 >> 0x10);
  auVar44._4_8_ = auVar222._8_8_;
  auVar44._2_2_ = uVar111;
  auVar44._0_2_ = uVar111;
  auVar225._0_4_ = ((float)(int)(short)uVar51 - fVar196) * fVar69;
  auVar225._4_4_ = ((float)(auVar44._0_4_ >> 0x10) - fVar197) * fVar114;
  auVar225._8_4_ = ((float)(auVar222._8_4_ >> 0x10) - fVar198) * fVar137;
  auVar225._12_4_ = ((float)(auVar223._12_4_ >> 0x10) - fVar170) * fVar153;
  auVar187._8_4_ = auVar172._8_4_;
  auVar187._0_8_ = auVar172._0_8_;
  auVar187._12_4_ = auVar172._12_4_;
  auVar188 = minps(auVar187,auVar203);
  auVar140._8_4_ = auVar120._8_4_;
  auVar140._0_8_ = auVar120._0_8_;
  auVar140._12_4_ = auVar120._12_4_;
  auVar77 = minps(auVar140,auVar235);
  auVar188 = maxps(auVar188,auVar77);
  auVar141._8_4_ = auVar90._8_4_;
  auVar141._0_8_ = auVar90._0_8_;
  auVar141._12_4_ = auVar90._12_4_;
  auVar77 = minps(auVar141,auVar225);
  auVar156._4_4_ = uVar54;
  auVar156._0_4_ = uVar54;
  auVar156._8_4_ = uVar54;
  auVar156._12_4_ = uVar54;
  auVar77 = maxps(auVar77,auVar156);
  auVar189 = maxps(auVar188,auVar77);
  auVar188 = maxps(auVar172,auVar203);
  auVar77 = maxps(auVar120,auVar235);
  auVar188 = minps(auVar188,auVar77);
  auVar77 = maxps(auVar90,auVar225);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar54;
  auVar121._0_4_ = uVar54;
  auVar121._8_4_ = uVar54;
  auVar121._12_4_ = uVar54;
  auVar77 = minps(auVar77,auVar121);
  local_1b8 = auVar189._0_4_ * 0.99999964;
  fStack_1b4 = auVar189._4_4_ * 0.99999964;
  fStack_1b0 = auVar189._8_4_ * 0.99999964;
  fStack_1ac = auVar189._12_4_ * 0.99999964;
  auVar77 = minps(auVar188,auVar77);
  auVar91._0_4_ = -(uint)(local_1b8 <= auVar77._0_4_ * 1.0000004 && PVar6 != (Primitive)0x0);
  auVar91._4_4_ = -(uint)(fStack_1b4 <= auVar77._4_4_ * 1.0000004 && 1 < (byte)PVar6);
  auVar91._8_4_ = -(uint)(fStack_1b0 <= auVar77._8_4_ * 1.0000004 && 2 < (byte)PVar6);
  auVar91._12_4_ = -(uint)(fStack_1ac <= auVar77._12_4_ * 1.0000004 && 3 < (byte)PVar6);
  uVar59 = movmskps((int)lVar50,auVar91);
  local_6b9 = uVar59 != 0;
  if (uVar59 == 0) {
    return local_6b9;
  }
  uVar59 = uVar59 & 0xff;
  local_178._0_12_ = mm_lookupmask_ps._240_12_;
  local_178._12_4_ = 0;
  local_440 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_378 = prim;
  local_380 = (RTCFilterFunctionNArguments *)(prim + uVar56 * 0x19 + 0x16);
LAB_00b20336:
  local_370 = (ulong)uVar59;
  lVar50 = 0;
  if (local_370 != 0) {
    for (; (uVar59 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
    }
  }
  local_370 = local_370 - 1 & local_370;
  local_368 = *(undefined4 *)(local_378 + lVar50 * 4 + 6);
  lVar50 = lVar50 * 0x40;
  lVar55 = 0;
  if (local_370 != 0) {
    for (; (local_370 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
    }
  }
  local_358 = *(uint *)(local_378 + 2);
  local_588 = (ulong)local_358;
  pfVar1 = (float *)((long)local_380 + lVar50);
  if (local_370 != 0) {
    uVar51 = local_370 - 1 & local_370;
    lVar55 = lVar55 << 6;
    if ((uVar51 != 0) && (lVar58 = 0, uVar51 != 0)) {
      for (; (uVar51 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
      }
    }
  }
  pfVar3 = (float *)((long)local_380 + lVar50 + 0x10);
  pfVar4 = (float *)((long)local_380 + lVar50 + 0x20);
  pfVar5 = (float *)((long)local_380 + lVar50 + 0x30);
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  fVar154 = *(float *)(ray + k * 4 + 0x50);
  local_5b8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
  local_408._4_4_ = fVar154;
  local_408._0_4_ = fStack_11c;
  fStack_400 = (float)local_5b8._4_4_;
  fStack_3fc = 0.0;
  fVar68 = fVar154 * fVar154;
  fVar69 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_;
  fVar116 = fVar68 + fStack_11c * fStack_11c + fVar69;
  local_418._0_8_ = CONCAT44(fVar68 + fVar68 + 0.0,fVar116);
  local_418._8_4_ = fVar68 + fVar69 + fVar69;
  local_418._12_4_ = fVar68 + 0.0 + 0.0;
  auVar173._8_4_ = local_418._8_4_;
  auVar173._0_8_ = local_418._0_8_;
  auVar173._12_4_ = local_418._12_4_;
  auVar77 = rcpss(auVar173,local_418);
  local_568 = (2.0 - fVar116 * auVar77._0_4_) * auVar77._0_4_ *
              (((pfVar1[2] + pfVar3[2] + pfVar4[2] + pfVar5[2]) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * (float)local_5b8._4_4_ +
              ((pfVar1[1] + pfVar3[1] + pfVar4[1] + pfVar5[1]) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * fVar154 +
              ((*pfVar1 + *pfVar3 + *pfVar4 + *pfVar5) * 0.25 - *(float *)(ray + k * 4)) *
              fStack_11c);
  local_558 = fStack_11c * local_568 + *(float *)(ray + k * 4);
  fStack_554 = fVar154 * local_568 + *(float *)(ray + k * 4 + 0x10);
  fStack_550 = (float)local_5b8._4_4_ * local_568 + *(float *)(ray + k * 4 + 0x20);
  fVar112 = *pfVar1 - local_558;
  fVar113 = pfVar1[1] - fStack_554;
  fVar114 = pfVar1[2] - fStack_550;
  fVar115 = pfVar1[3] - 0.0;
  local_548 = *pfVar4 - local_558;
  fStack_544 = pfVar4[1] - fStack_554;
  fStack_540 = pfVar4[2] - fStack_550;
  fStack_53c = pfVar4[3] - 0.0;
  local_538 = *pfVar3 - local_558;
  fStack_534 = pfVar3[1] - fStack_554;
  fStack_530 = pfVar3[2] - fStack_550;
  fStack_52c = pfVar3[3] - 0.0;
  local_558 = *pfVar5 - local_558;
  fStack_554 = pfVar5[1] - fStack_554;
  fStack_550 = pfVar5[2] - fStack_550;
  fStack_54c = pfVar5[3] - 0.0;
  local_278 = fVar112;
  fStack_274 = fVar112;
  fStack_270 = fVar112;
  fStack_26c = fVar112;
  local_288 = fVar113;
  fStack_284 = fVar113;
  fStack_280 = fVar113;
  fStack_27c = fVar113;
  local_138 = fVar114;
  fStack_134 = fVar114;
  fStack_130 = fVar114;
  fStack_12c = fVar114;
  local_298 = fVar115;
  fStack_294 = fVar115;
  fStack_290 = fVar115;
  fStack_28c = fVar115;
  fVar68 = fVar154 * fVar154;
  local_2a8 = local_538;
  fStack_2a4 = local_538;
  fStack_2a0 = local_538;
  fStack_29c = local_538;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar68 + fVar69;
  fStack_124 = fStack_11c + fVar68 + fVar69;
  fStack_120 = fStack_11c + fVar68 + fVar69;
  fStack_11c = fStack_11c + fVar68 + fVar69;
  local_148 = fStack_534;
  fStack_144 = fStack_534;
  fStack_140 = fStack_534;
  fStack_13c = fStack_534;
  local_2b8 = fStack_530;
  fStack_2b4 = fStack_530;
  fStack_2b0 = fStack_530;
  fStack_2ac = fStack_530;
  local_2c8 = fStack_52c;
  fStack_2c4 = fStack_52c;
  fStack_2c0 = fStack_52c;
  fStack_2bc = fStack_52c;
  local_2d8 = local_548;
  fStack_2d4 = local_548;
  fStack_2d0 = local_548;
  fStack_2cc = local_548;
  local_2e8 = fStack_544;
  fStack_2e4 = fStack_544;
  fStack_2e0 = fStack_544;
  fStack_2dc = fStack_544;
  local_2f8 = fStack_540;
  fStack_2f4 = fStack_540;
  fStack_2f0 = fStack_540;
  fStack_2ec = fStack_540;
  local_308 = fStack_53c;
  fStack_304 = fStack_53c;
  fStack_300 = fStack_53c;
  fStack_2fc = fStack_53c;
  local_158 = local_558;
  fStack_154 = local_558;
  fStack_150 = local_558;
  fStack_14c = local_558;
  local_318 = fStack_554;
  fStack_314 = fStack_554;
  fStack_310 = fStack_554;
  fStack_30c = fStack_554;
  local_328 = fStack_550;
  fStack_324 = fStack_550;
  fStack_320 = fStack_550;
  fStack_31c = fStack_550;
  local_338 = fStack_54c;
  fStack_334 = fStack_54c;
  fStack_330 = fStack_54c;
  fStack_32c = fStack_54c;
  local_428 = *(float *)(ray + k * 4 + 0x40);
  fStack_424 = local_428;
  fStack_420 = local_428;
  fStack_41c = local_428;
  local_5b8._0_4_ = local_5b8._4_4_;
  fStack_5b0 = (float)local_5b8._4_4_;
  fStack_5ac = (float)local_5b8._4_4_;
  local_348 = ABS(local_128);
  fStack_344 = ABS(fStack_124);
  fStack_340 = ABS(fStack_120);
  fStack_33c = ABS(fStack_11c);
  fVar68 = *(float *)(ray + k * 4 + 0x30);
  local_3b8 = ZEXT416((uint)local_568);
  local_168 = fVar68 - local_568;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  uStack_354 = local_358;
  uStack_350 = local_358;
  uStack_34c = local_358;
  uStack_364 = local_368;
  uStack_360 = local_368;
  uStack_35c = local_368;
  lVar50 = 1;
  local_580 = (RTCFilterFunctionNArguments *)0x1;
  uVar51 = 0;
  bVar52 = 0;
  local_4c8 = 0.0;
  fStack_4c4 = 1.0;
  uStack_4c0 = 0;
  uStack_4bc = 0;
  pRVar57 = local_380;
  fStack_564 = local_568;
  fStack_560 = local_568;
  fStack_55c = local_568;
  do {
    local_488 = fStack_4c4 - local_4c8;
    fVar185 = local_488 * 0.11111111;
    fStack_484 = local_488;
    fStack_480 = local_488;
    fStack_47c = local_488;
    local_498._4_4_ = local_4c8;
    local_498._0_4_ = local_4c8;
    fStack_490 = local_4c8;
    fStack_48c = local_4c8;
    fVar233 = local_488 * 0.0 + local_4c8;
    fVar234 = local_488 * 0.33333334 + local_4c8;
    fVar240 = local_488 * 0.6666667 + local_4c8;
    fVar241 = local_488 * 1.0 + local_4c8;
    fVar196 = 1.0 - fVar233;
    fVar197 = 1.0 - fVar234;
    fVar198 = 1.0 - fVar240;
    fVar170 = 1.0 - fVar241;
    fVar69 = fVar233 * fVar196;
    fVar137 = fVar234 * fVar197;
    fVar138 = fVar240 * fVar198;
    fVar139 = fVar241 * fVar170;
    fVar153 = fVar196 * fVar196 * fVar196;
    fVar168 = fVar197 * fVar197 * fVar197;
    fVar183 = fVar198 * fVar198 * fVar198;
    fVar184 = fVar170 * fVar170 * fVar170;
    fVar253 = fVar233 * fVar233 * fVar233;
    fVar254 = fVar234 * fVar234 * fVar234;
    fVar257 = fVar240 * fVar240 * fVar240;
    fVar264 = fVar241 * fVar241 * fVar241;
    fVar155 = fVar153 * 0.16666667;
    fVar169 = fVar168 * 0.16666667;
    fVar209 = fVar183 * 0.16666667;
    fVar210 = fVar184 * 0.16666667;
    fVar242 = (fVar233 * fVar69 * 6.0 + fVar196 * fVar69 * 12.0 + fVar153 * 4.0 + fVar253) *
              0.16666667;
    fVar244 = (fVar234 * fVar137 * 6.0 + fVar197 * fVar137 * 12.0 + fVar168 * 4.0 + fVar254) *
              0.16666667;
    fVar245 = (fVar240 * fVar138 * 6.0 + fVar198 * fVar138 * 12.0 + fVar183 * 4.0 + fVar257) *
              0.16666667;
    fVar246 = (fVar241 * fVar139 * 6.0 + fVar170 * fVar139 * 12.0 + fVar184 * 4.0 + fVar264) *
              0.16666667;
    fVar153 = (fVar196 * fVar69 * 6.0 + fVar233 * fVar69 * 12.0 + fVar253 * 4.0 + fVar153) *
              0.16666667;
    fVar168 = (fVar197 * fVar137 * 6.0 + fVar234 * fVar137 * 12.0 + fVar254 * 4.0 + fVar168) *
              0.16666667;
    fVar211 = (fVar198 * fVar138 * 6.0 + fVar240 * fVar138 * 12.0 + fVar257 * 4.0 + fVar183) *
              0.16666667;
    fVar232 = (fVar170 * fVar139 * 6.0 + fVar241 * fVar139 * 12.0 + fVar264 * 4.0 + fVar184) *
              0.16666667;
    fVar253 = fVar253 * 0.16666667;
    fVar254 = fVar254 * 0.16666667;
    fVar257 = fVar257 * 0.16666667;
    fVar264 = fVar264 * 0.16666667;
    fVar278 = local_278 * fVar155 + local_2a8 * fVar242 + local_2d8 * fVar153 + local_158 * fVar253;
    fVar281 = fStack_274 * fVar169 +
              fStack_2a4 * fVar244 + fStack_2d4 * fVar168 + fStack_154 * fVar254;
    fVar255 = fStack_270 * fVar209 +
              fStack_2a0 * fVar245 + fStack_2d0 * fVar211 + fStack_150 * fVar257;
    fVar256 = fStack_26c * fVar210 +
              fStack_29c * fVar246 + fStack_2cc * fVar232 + fStack_14c * fVar264;
    fVar300 = local_288 * fVar155 + local_148 * fVar242 + local_2e8 * fVar153 + local_318 * fVar253;
    fVar305 = fStack_284 * fVar169 +
              fStack_144 * fVar244 + fStack_2e4 * fVar168 + fStack_314 * fVar254;
    fVar306 = fStack_280 * fVar209 +
              fStack_140 * fVar245 + fStack_2e0 * fVar211 + fStack_310 * fVar257;
    fVar307 = fStack_27c * fVar210 +
              fStack_13c * fVar246 + fStack_2dc * fVar232 + fStack_30c * fVar264;
    fVar292 = local_138 * fVar155 + local_2b8 * fVar242 + local_2f8 * fVar153 + local_328 * fVar253;
    fVar297 = fStack_134 * fVar169 +
              fStack_2b4 * fVar244 + fStack_2f4 * fVar168 + fStack_324 * fVar254;
    fVar298 = fStack_130 * fVar209 +
              fStack_2b0 * fVar245 + fStack_2f0 * fVar211 + fStack_320 * fVar257;
    fVar299 = fStack_12c * fVar210 +
              fStack_2ac * fVar246 + fStack_2ec * fVar232 + fStack_31c * fVar264;
    fVar183 = fVar155 * local_298 + fVar242 * local_2c8 + fVar153 * local_308 + fVar253 * local_338;
    fVar184 = fVar169 * fStack_294 +
              fVar244 * fStack_2c4 + fVar168 * fStack_304 + fVar254 * fStack_334;
    auVar157._0_8_ = CONCAT44(fVar184,fVar183);
    auVar157._8_4_ =
         fVar209 * fStack_290 + fVar245 * fStack_2c0 + fVar211 * fStack_300 + fVar257 * fStack_330;
    auVar157._12_4_ =
         fVar210 * fStack_28c + fVar246 * fStack_2bc + fVar232 * fStack_2fc + fVar264 * fStack_32c;
    fVar153 = -fVar196 * fVar196 * 0.5;
    fVar155 = -fVar197 * fVar197 * 0.5;
    fVar168 = -fVar198 * fVar198 * 0.5;
    fVar169 = -fVar170 * fVar170 * 0.5;
    fVar209 = (-fVar233 * fVar233 - fVar69 * 4.0) * 0.5;
    fVar210 = (-fVar234 * fVar234 - fVar137 * 4.0) * 0.5;
    fVar211 = (-fVar240 * fVar240 - fVar138 * 4.0) * 0.5;
    fVar232 = (-fVar241 * fVar241 - fVar139 * 4.0) * 0.5;
    fVar69 = (fVar69 * 4.0 + fVar196 * fVar196) * 0.5;
    fVar137 = (fVar137 * 4.0 + fVar197 * fVar197) * 0.5;
    fVar138 = (fVar138 * 4.0 + fVar198 * fVar198) * 0.5;
    fVar139 = (fVar139 * 4.0 + fVar170 * fVar170) * 0.5;
    fVar198 = fVar233 * fVar233 * 0.5;
    fVar196 = fVar234 * fVar234 * 0.5;
    fVar197 = fVar240 * fVar240 * 0.5;
    fVar170 = fVar241 * fVar241 * 0.5;
    fVar284 = (local_278 * fVar153 + local_2a8 * fVar209 + local_2d8 * fVar69 + local_158 * fVar198)
              * fVar185;
    local_458 = (fStack_274 * fVar155 +
                fStack_2a4 * fVar210 + fStack_2d4 * fVar137 + fStack_154 * fVar196) * fVar185;
    fStack_454 = (fStack_270 * fVar168 +
                 fStack_2a0 * fVar211 + fStack_2d0 * fVar138 + fStack_150 * fVar197) * fVar185;
    fStack_450 = (fStack_26c * fVar169 +
                 fStack_29c * fVar232 + fStack_2cc * fVar139 + fStack_14c * fVar170) * fVar185;
    fVar253 = (local_288 * fVar153 + local_148 * fVar209 + local_2e8 * fVar69 + local_318 * fVar198)
              * fVar185;
    fVar257 = (fStack_284 * fVar155 +
              fStack_144 * fVar210 + fStack_2e4 * fVar137 + fStack_314 * fVar196) * fVar185;
    fVar266 = (fStack_280 * fVar168 +
              fStack_140 * fVar211 + fStack_2e0 * fVar138 + fStack_310 * fVar197) * fVar185;
    fVar270 = (fStack_27c * fVar169 +
              fStack_13c * fVar232 + fStack_2dc * fVar139 + fStack_30c * fVar170) * fVar185;
    fVar271 = (local_138 * fVar153 + local_2b8 * fVar209 + local_2f8 * fVar69 + local_328 * fVar198)
              * fVar185;
    fVar276 = (fStack_134 * fVar155 +
              fStack_2b4 * fVar210 + fStack_2f4 * fVar137 + fStack_324 * fVar196) * fVar185;
    fVar279 = (fStack_130 * fVar168 +
              fStack_2b0 * fVar211 + fStack_2f0 * fVar138 + fStack_320 * fVar197) * fVar185;
    fVar282 = (fStack_12c * fVar169 +
              fStack_2ac * fVar232 + fStack_2ec * fVar139 + fStack_31c * fVar170) * fVar185;
    fVar265 = fVar185 * (fVar155 * fStack_294 +
                        fVar210 * fStack_2c4 + fVar137 * fStack_304 + fVar196 * fStack_334);
    fVar267 = fVar185 * (fVar168 * fStack_290 +
                        fVar211 * fStack_2c0 + fVar138 * fStack_300 + fVar197 * fStack_330);
    fVar269 = fVar185 * (fVar169 * fStack_28c +
                        fVar232 * fStack_2bc + fVar139 * fStack_2fc + fVar170 * fStack_32c);
    auVar122._4_4_ = auVar157._8_4_;
    auVar122._0_4_ = fVar184;
    auVar122._8_4_ = auVar157._12_4_;
    auVar122._12_4_ = 0;
    auVar174._0_8_ = CONCAT44(auVar157._8_4_ - fVar267,fVar184 - fVar265);
    auVar174._8_4_ = auVar157._12_4_ - fVar269;
    auVar174._12_4_ = 0;
    local_4b8 = fVar305 - fVar300;
    fStack_4b4 = fVar306 - fVar305;
    fStack_4b0 = fVar307 - fVar306;
    fStack_4ac = 0.0 - fVar307;
    local_4d8._0_4_ = fVar297 - fVar292;
    local_4d8._4_4_ = fVar298 - fVar297;
    fStack_4d0 = fVar299 - fVar298;
    fStack_4cc = 0.0 - fVar299;
    fVar170 = fVar253 * (float)local_4d8._0_4_ - fVar271 * local_4b8;
    fVar210 = fVar257 * (float)local_4d8._4_4_ - fVar276 * fStack_4b4;
    fVar211 = fVar266 * fStack_4d0 - fVar279 * fStack_4b0;
    fVar232 = fVar270 * fStack_4cc - fVar282 * fStack_4ac;
    local_4e8._0_4_ = fVar281 - fVar278;
    local_4e8._4_4_ = fVar255 - fVar281;
    fStack_4e0 = fVar256 - fVar255;
    fStack_4dc = 0.0 - fVar256;
    fVar168 = fVar271 * (float)local_4e8._0_4_ - fVar284 * (float)local_4d8._0_4_;
    fVar169 = fVar276 * (float)local_4e8._4_4_ - local_458 * (float)local_4d8._4_4_;
    fVar196 = fVar279 * fStack_4e0 - fStack_454 * fStack_4d0;
    fVar197 = fVar282 * fStack_4dc - fStack_450 * fStack_4cc;
    fVar233 = fVar284 * local_4b8 - fVar253 * (float)local_4e8._0_4_;
    fVar240 = local_458 * fStack_4b4 - fVar257 * (float)local_4e8._4_4_;
    fVar242 = fStack_454 * fStack_4b0 - fVar266 * fStack_4e0;
    fVar245 = fStack_450 * fStack_4ac - fVar270 * fStack_4dc;
    auVar190._0_4_ = local_4b8 * local_4b8 + (float)local_4d8._0_4_ * (float)local_4d8._0_4_;
    auVar190._4_4_ = fStack_4b4 * fStack_4b4 + (float)local_4d8._4_4_ * (float)local_4d8._4_4_;
    auVar190._8_4_ = fStack_4b0 * fStack_4b0 + fStack_4d0 * fStack_4d0;
    auVar190._12_4_ = fStack_4ac * fStack_4ac + fStack_4cc * fStack_4cc;
    auVar236._0_4_ = (float)local_4e8._0_4_ * (float)local_4e8._0_4_ + auVar190._0_4_;
    auVar236._4_4_ = (float)local_4e8._4_4_ * (float)local_4e8._4_4_ + auVar190._4_4_;
    auVar236._8_4_ = fStack_4e0 * fStack_4e0 + auVar190._8_4_;
    auVar236._12_4_ = fStack_4dc * fStack_4dc + auVar190._12_4_;
    auVar77 = rcpps(auVar190,auVar236);
    fVar137 = auVar77._0_4_;
    fVar138 = auVar77._4_4_;
    fVar139 = auVar77._8_4_;
    fVar155 = auVar77._12_4_;
    fVar137 = (1.0 - fVar137 * auVar236._0_4_) * fVar137 + fVar137;
    fVar138 = (1.0 - fVar138 * auVar236._4_4_) * fVar138 + fVar138;
    fVar139 = (1.0 - fVar139 * auVar236._8_4_) * fVar139 + fVar139;
    fVar155 = (1.0 - fVar155 * auVar236._12_4_) * fVar155 + fVar155;
    fVar234 = (float)local_4d8._0_4_ * fVar257 - local_4b8 * fVar276;
    fVar241 = (float)local_4d8._4_4_ * fVar266 - fStack_4b4 * fVar279;
    fVar244 = fStack_4d0 * fVar270 - fStack_4b0 * fVar282;
    fVar246 = fStack_4cc * 0.0 - fStack_4ac * 0.0;
    fVar254 = (float)local_4e8._0_4_ * fVar276 - (float)local_4d8._0_4_ * local_458;
    fVar264 = (float)local_4e8._4_4_ * fVar279 - (float)local_4d8._4_4_ * fStack_454;
    fVar268 = fStack_4e0 * fVar282 - fStack_4d0 * fStack_450;
    fVar275 = fStack_4dc * 0.0 - fStack_4cc * 0.0;
    fStack_44c = 0.0;
    fVar272 = local_4b8 * local_458 - (float)local_4e8._0_4_ * fVar257;
    fVar277 = fStack_4b4 * fStack_454 - (float)local_4e8._4_4_ * fVar266;
    fVar280 = fStack_4b0 * fStack_450 - fStack_4e0 * fVar270;
    fVar283 = fStack_4ac * 0.0 - fStack_4dc * 0.0;
    auVar204._0_4_ = (fVar170 * fVar170 + fVar168 * fVar168 + fVar233 * fVar233) * fVar137;
    auVar204._4_4_ = (fVar210 * fVar210 + fVar169 * fVar169 + fVar240 * fVar240) * fVar138;
    auVar204._8_4_ = (fVar211 * fVar211 + fVar196 * fVar196 + fVar242 * fVar242) * fVar139;
    auVar204._12_4_ = (fVar232 * fVar232 + fVar197 * fVar197 + fVar245 * fVar245) * fVar155;
    auVar226._0_4_ = (fVar234 * fVar234 + fVar254 * fVar254 + fVar272 * fVar272) * fVar137;
    auVar226._4_4_ = (fVar241 * fVar241 + fVar264 * fVar264 + fVar277 * fVar277) * fVar138;
    auVar226._8_4_ = (fVar244 * fVar244 + fVar268 * fVar268 + fVar280 * fVar280) * fVar139;
    auVar226._12_4_ = (fVar246 * fVar246 + fVar275 * fVar275 + fVar283 * fVar283) * fVar155;
    auVar205 = maxps(auVar204,auVar226);
    auVar92._0_4_ =
         fVar185 * (fVar153 * local_298 +
                   fVar209 * local_2c8 + fVar69 * local_308 + fVar198 * local_338) + fVar183;
    auVar92._4_4_ = fVar265 + fVar184;
    auVar92._8_4_ = fVar267 + auVar157._8_4_;
    auVar92._12_4_ = fVar269 + auVar157._12_4_;
    auVar142._8_4_ = auVar157._8_4_;
    auVar142._0_8_ = auVar157._0_8_;
    auVar142._12_4_ = auVar157._12_4_;
    auVar77 = maxps(auVar142,auVar92);
    auVar191._8_4_ = auVar174._8_4_;
    auVar191._0_8_ = auVar174._0_8_;
    auVar191._12_4_ = 0;
    auVar188 = maxps(auVar191,auVar122);
    auVar189 = maxps(auVar77,auVar188);
    auVar77 = minps(auVar157,auVar92);
    auVar188 = minps(auVar174,auVar122);
    auVar158 = minps(auVar77,auVar188);
    auVar77 = sqrtps(auVar122,auVar205);
    auVar188 = rsqrtps(auVar77,auVar236);
    fVar69 = auVar188._0_4_;
    fVar137 = auVar188._4_4_;
    fVar138 = auVar188._8_4_;
    fVar139 = auVar188._12_4_;
    fVar69 = fVar69 * 1.5 - fVar69 * fVar69 * auVar236._0_4_ * 0.5 * fVar69;
    fVar137 = fVar137 * 1.5 - fVar137 * fVar137 * auVar236._4_4_ * 0.5 * fVar137;
    local_188._4_4_ = fVar137;
    local_188._0_4_ = fVar69;
    fVar138 = fVar138 * 1.5 - fVar138 * fVar138 * auVar236._8_4_ * 0.5 * fVar138;
    fVar139 = fVar139 * 1.5 - fVar139 * fVar139 * auVar236._12_4_ * 0.5 * fVar139;
    local_468 = 0.0 - fVar300;
    fStack_464 = 0.0 - fVar305;
    fStack_460 = 0.0 - fVar306;
    fStack_45c = 0.0 - fVar307;
    local_478 = 0.0 - fVar292;
    fStack_474 = 0.0 - fVar297;
    fStack_470 = 0.0 - fVar298;
    fStack_46c = 0.0 - fVar299;
    fVar210 = 0.0 - fVar278;
    fVar211 = 0.0 - fVar281;
    fVar232 = 0.0 - fVar255;
    fVar233 = 0.0 - fVar256;
    local_188._8_4_ = fVar138;
    local_188._12_4_ = fVar139;
    local_198 = local_428 * (float)local_4e8._0_4_ * fVar69 +
                fVar154 * local_4b8 * fVar69 +
                (float)local_5b8._4_4_ * (float)local_4d8._0_4_ * fVar69;
    fStack_194 = fStack_424 * (float)local_4e8._4_4_ * fVar137 +
                 fVar154 * fStack_4b4 * fVar137 +
                 (float)local_5b8._4_4_ * (float)local_4d8._4_4_ * fVar137;
    fStack_190 = fStack_420 * fStack_4e0 * fVar138 +
                 fVar154 * fStack_4b0 * fVar138 + (float)local_5b8._4_4_ * fStack_4d0 * fVar138;
    fStack_18c = fStack_41c * fStack_4dc * fVar139 +
                 fVar154 * fStack_4ac * fVar139 + (float)local_5b8._4_4_ * fStack_4cc * fVar139;
    auVar293._0_4_ = local_4b8 * fVar69 * local_468 + (float)local_4d8._0_4_ * fVar69 * local_478;
    auVar293._4_4_ =
         fStack_4b4 * fVar137 * fStack_464 + (float)local_4d8._4_4_ * fVar137 * fStack_474;
    auVar293._8_4_ = fStack_4b0 * fVar138 * fStack_460 + fStack_4d0 * fVar138 * fStack_470;
    auVar293._12_4_ = fStack_4ac * fVar139 * fStack_45c + fStack_4cc * fVar139 * fStack_46c;
    local_3c8._0_4_ = (float)local_4e8._0_4_ * fVar69 * fVar210 + auVar293._0_4_;
    local_3c8._4_4_ = (float)local_4e8._4_4_ * fVar137 * fVar211 + auVar293._4_4_;
    local_3c8._8_4_ = fStack_4e0 * fVar138 * fVar232 + auVar293._8_4_;
    local_3c8._12_4_ = fStack_4dc * fVar139 * fVar233 + auVar293._12_4_;
    fVar153 = (local_428 * fVar210 + fVar154 * local_468 + (float)local_5b8._4_4_ * local_478) -
              local_198 * (float)local_3c8._0_4_;
    fVar155 = (fStack_424 * fVar211 + fVar154 * fStack_464 + (float)local_5b8._4_4_ * fStack_474) -
              fStack_194 * (float)local_3c8._4_4_;
    fVar168 = (fStack_420 * fVar232 + fVar154 * fStack_460 + (float)local_5b8._4_4_ * fStack_470) -
              fStack_190 * (float)local_3c8._8_4_;
    fVar169 = (fStack_41c * fVar233 + fVar154 * fStack_45c + (float)local_5b8._4_4_ * fStack_46c) -
              fStack_18c * (float)local_3c8._12_4_;
    fVar170 = (fVar210 * fVar210 + local_468 * local_468 + local_478 * local_478) -
              (float)local_3c8._0_4_ * (float)local_3c8._0_4_;
    fVar183 = (fVar211 * fVar211 + fStack_464 * fStack_464 + fStack_474 * fStack_474) -
              (float)local_3c8._4_4_ * (float)local_3c8._4_4_;
    fVar184 = (fVar232 * fVar232 + fStack_460 * fStack_460 + fStack_470 * fStack_470) -
              (float)local_3c8._8_4_ * (float)local_3c8._8_4_;
    fVar209 = (fVar233 * fVar233 + fStack_45c * fStack_45c + fStack_46c * fStack_46c) -
              (float)local_3c8._12_4_ * (float)local_3c8._12_4_;
    fVar185 = (auVar189._0_4_ + auVar77._0_4_) * 1.0000002;
    fVar196 = (auVar189._4_4_ + auVar77._4_4_) * 1.0000002;
    fVar197 = (auVar189._8_4_ + auVar77._8_4_) * 1.0000002;
    fVar198 = (auVar189._12_4_ + auVar77._12_4_) * 1.0000002;
    auVar227._0_4_ = fVar170 - fVar185 * fVar185;
    auVar227._4_4_ = fVar183 - fVar196 * fVar196;
    auVar227._8_4_ = fVar184 - fVar197 * fVar197;
    auVar227._12_4_ = fVar209 - fVar198 * fVar198;
    fVar185 = local_198 * local_198;
    fVar196 = fStack_194 * fStack_194;
    local_1a8._0_8_ = CONCAT44(fVar196,fVar185);
    local_1a8._8_4_ = fStack_190 * fStack_190;
    local_1a8._12_4_ = fStack_18c * fStack_18c;
    local_438._0_4_ = local_128 - fVar185;
    local_438._4_4_ = fStack_124 - fVar196;
    fStack_430 = fStack_120 - local_1a8._8_4_;
    fStack_42c = fStack_11c - local_1a8._12_4_;
    fVar153 = fVar153 + fVar153;
    fVar155 = fVar155 + fVar155;
    fVar168 = fVar168 + fVar168;
    fVar169 = fVar169 + fVar169;
    local_4f8._0_4_ = fVar153 * fVar153;
    local_4f8._4_4_ = fVar155 * fVar155;
    fStack_4f0 = fVar168 * fVar168;
    fStack_4ec = fVar169 * fVar169;
    local_3d8 = (float)local_438._0_4_ * 4.0;
    fStack_3d4 = (float)local_438._4_4_ * 4.0;
    fStack_3d0 = fStack_430 * 4.0;
    fStack_3cc = fStack_42c * 4.0;
    auVar143._0_4_ = (float)local_4f8._0_4_ - local_3d8 * auVar227._0_4_;
    auVar143._4_4_ = (float)local_4f8._4_4_ - fStack_3d4 * auVar227._4_4_;
    auVar143._8_4_ = fStack_4f0 - fStack_3d0 * auVar227._8_4_;
    auVar143._12_4_ = fStack_4ec - fStack_3cc * auVar227._12_4_;
    local_4a8 = (auVar158._0_4_ - auVar77._0_4_) * 0.99999976;
    fStack_4a4 = (auVar158._4_4_ - auVar77._4_4_) * 0.99999976;
    fStack_4a0 = (auVar158._8_4_ - auVar77._8_4_) * 0.99999976;
    fStack_49c = (auVar158._12_4_ - auVar77._12_4_) * 0.99999976;
    auVar159._4_4_ = -(uint)(0.0 <= auVar143._4_4_);
    auVar159._0_4_ = -(uint)(0.0 <= auVar143._0_4_);
    auVar159._8_4_ = -(uint)(0.0 <= auVar143._8_4_);
    auVar159._12_4_ = -(uint)(0.0 <= auVar143._12_4_);
    uVar54 = (undefined4)((ulong)lVar50 >> 0x20);
    iVar45 = movmskps((int)lVar50,auVar159);
    if (iVar45 == 0) {
      iVar45 = 0;
      auVar193 = _DAT_01feb9f0;
      auVar229 = _DAT_01feba00;
    }
    else {
      auVar188 = sqrtps(auVar293,auVar143);
      uVar59 = -(uint)(0.0 <= auVar143._0_4_);
      uVar61 = -(uint)(0.0 <= auVar143._4_4_);
      uVar63 = -(uint)(0.0 <= auVar143._8_4_);
      uVar65 = -(uint)(0.0 <= auVar143._12_4_);
      auVar192._0_4_ = (float)local_438._0_4_ + (float)local_438._0_4_;
      auVar192._4_4_ = (float)local_438._4_4_ + (float)local_438._4_4_;
      auVar192._8_4_ = fStack_430 + fStack_430;
      auVar192._12_4_ = fStack_42c + fStack_42c;
      auVar77 = rcpps(auVar227,auVar192);
      fVar197 = auVar77._0_4_;
      fVar234 = auVar77._4_4_;
      fVar241 = auVar77._8_4_;
      fVar244 = auVar77._12_4_;
      fVar197 = (1.0 - auVar192._0_4_ * fVar197) * fVar197 + fVar197;
      fVar234 = (1.0 - auVar192._4_4_ * fVar234) * fVar234 + fVar234;
      fVar241 = (1.0 - auVar192._8_4_ * fVar241) * fVar241 + fVar241;
      fVar244 = (1.0 - auVar192._12_4_ * fVar244) * fVar244 + fVar244;
      fVar198 = (-fVar153 - auVar188._0_4_) * fVar197;
      fVar240 = (-fVar155 - auVar188._4_4_) * fVar234;
      fVar242 = (-fVar168 - auVar188._8_4_) * fVar241;
      fVar245 = (-fVar169 - auVar188._12_4_) * fVar244;
      fVar197 = (auVar188._0_4_ - fVar153) * fVar197;
      fVar234 = (auVar188._4_4_ - fVar155) * fVar234;
      fVar241 = (auVar188._8_4_ - fVar168) * fVar241;
      fVar244 = (auVar188._12_4_ - fVar169) * fVar244;
      local_398[0] = (local_198 * fVar198 + (float)local_3c8._0_4_) * fVar69;
      local_398[1] = (fStack_194 * fVar240 + (float)local_3c8._4_4_) * fVar137;
      local_398[2] = (fStack_190 * fVar242 + (float)local_3c8._8_4_) * fVar138;
      local_398[3] = (fStack_18c * fVar245 + (float)local_3c8._12_4_) * fVar139;
      local_3a8[0] = (local_198 * fVar197 + (float)local_3c8._0_4_) * fVar69;
      local_3a8[1] = (fStack_194 * fVar234 + (float)local_3c8._4_4_) * fVar137;
      local_3a8[2] = (fStack_190 * fVar241 + (float)local_3c8._8_4_) * fVar138;
      local_3a8[3] = (fStack_18c * fVar244 + (float)local_3c8._12_4_) * fVar139;
      auVar228._0_4_ = (uint)fVar198 & uVar59;
      auVar228._4_4_ = (uint)fVar240 & uVar61;
      auVar228._8_4_ = (uint)fVar242 & uVar63;
      auVar228._12_4_ = (uint)fVar245 & uVar65;
      auVar193._0_8_ = CONCAT44(~uVar61,~uVar59) & 0x7f8000007f800000;
      auVar193._8_4_ = ~uVar63 & 0x7f800000;
      auVar193._12_4_ = ~uVar65 & 0x7f800000;
      auVar193 = auVar193 | auVar228;
      auVar294._0_4_ = (uint)fVar197 & uVar59;
      auVar294._4_4_ = (uint)fVar234 & uVar61;
      auVar294._8_4_ = (uint)fVar241 & uVar63;
      auVar294._12_4_ = (uint)fVar244 & uVar65;
      auVar229._0_8_ = CONCAT44(~uVar61,~uVar59) & 0xff800000ff800000;
      auVar229._8_4_ = ~uVar63 & 0xff800000;
      auVar229._12_4_ = ~uVar65 & 0xff800000;
      auVar229 = auVar229 | auVar294;
      auVar237._0_8_ = CONCAT44(fVar196,fVar185) & 0x7fffffff7fffffff;
      auVar237._8_4_ = ABS(local_1a8._8_4_);
      auVar237._12_4_ = ABS(local_1a8._12_4_);
      auVar26._4_4_ = fStack_344;
      auVar26._0_4_ = local_348;
      auVar26._8_4_ = fStack_340;
      auVar26._12_4_ = fStack_33c;
      auVar77 = maxps(auVar26,auVar237);
      fVar185 = auVar77._0_4_ * 1.9073486e-06;
      fVar196 = auVar77._4_4_ * 1.9073486e-06;
      fVar197 = auVar77._8_4_ * 1.9073486e-06;
      fVar198 = auVar77._12_4_ * 1.9073486e-06;
      auVar295._0_4_ = -(uint)(ABS((float)local_438._0_4_) < fVar185 && 0.0 <= auVar143._0_4_);
      auVar295._4_4_ = -(uint)(ABS((float)local_438._4_4_) < fVar196 && 0.0 <= auVar143._4_4_);
      auVar295._8_4_ = -(uint)(ABS(fStack_430) < fVar197 && 0.0 <= auVar143._8_4_);
      auVar295._12_4_ = -(uint)(ABS(fStack_42c) < fVar198 && 0.0 <= auVar143._12_4_);
      iVar45 = movmskps(iVar45,auVar295);
      if (iVar45 != 0) {
        auVar238._4_4_ = -(uint)(fVar196 <= ABS((float)local_438._4_4_));
        auVar238._0_4_ = -(uint)(fVar185 <= ABS((float)local_438._0_4_));
        auVar238._8_4_ = -(uint)(fVar197 <= ABS(fStack_430));
        auVar238._12_4_ = -(uint)(fVar198 <= ABS(fStack_42c));
        uVar60 = -(uint)(auVar227._0_4_ <= 0.0);
        uVar62 = -(uint)(auVar227._4_4_ <= 0.0);
        uVar64 = -(uint)(auVar227._8_4_ <= 0.0);
        uVar66 = -(uint)(auVar227._12_4_ <= 0.0);
        auVar123._4_4_ = uVar62;
        auVar123._0_4_ = uVar60;
        auVar123._8_4_ = uVar64;
        auVar123._12_4_ = uVar66;
        auVar274._0_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar295._0_4_;
        auVar274._4_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar295._4_4_;
        auVar274._8_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar295._8_4_;
        auVar274._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar295._12_4_;
        auVar262._0_4_ = ~auVar295._0_4_ & auVar193._0_4_;
        auVar262._4_4_ = ~auVar295._4_4_ & auVar193._4_4_;
        auVar262._8_4_ = ~auVar295._8_4_ & auVar193._8_4_;
        auVar262._12_4_ = ~auVar295._12_4_ & auVar193._12_4_;
        auVar194._0_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar295._0_4_;
        auVar194._4_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar295._4_4_;
        auVar194._8_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar295._8_4_;
        auVar194._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar295._12_4_;
        auVar296._0_4_ = ~auVar295._0_4_ & auVar229._0_4_;
        auVar296._4_4_ = ~auVar295._4_4_ & auVar229._4_4_;
        auVar296._8_4_ = ~auVar295._8_4_ & auVar229._8_4_;
        auVar296._12_4_ = ~auVar295._12_4_ & auVar229._12_4_;
        auVar123 = auVar123 | auVar238;
        auVar159._4_4_ = auVar123._4_4_ & uVar61;
        auVar159._0_4_ = auVar123._0_4_ & uVar59;
        auVar159._8_4_ = auVar123._8_4_ & uVar63;
        auVar159._12_4_ = auVar123._12_4_ & uVar65;
        auVar193 = auVar262 | auVar274;
        auVar229 = auVar296 | auVar194;
      }
    }
    auVar160._0_4_ = (auVar159._0_4_ << 0x1f) >> 0x1f;
    auVar160._4_4_ = (auVar159._4_4_ << 0x1f) >> 0x1f;
    auVar160._8_4_ = (auVar159._8_4_ << 0x1f) >> 0x1f;
    auVar160._12_4_ = (auVar159._12_4_ << 0x1f) >> 0x1f;
    auVar160 = auVar160 & local_178;
    iVar45 = movmskps(iVar45,auVar160);
    lVar50 = CONCAT44(uVar54,iVar45);
    fVar185 = local_568;
    fVar196 = fStack_564;
    fVar197 = fStack_560;
    fVar198 = fStack_55c;
    if (iVar45 != 0) {
      auVar263._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_3b8._0_4_;
      auVar263._4_4_ = auVar263._0_4_;
      auVar263._8_4_ = auVar263._0_4_;
      auVar263._12_4_ = auVar263._0_4_;
      auVar189 = minps(auVar263,auVar229);
      auVar28._4_4_ = fStack_164;
      auVar28._0_4_ = local_168;
      auVar28._8_4_ = fStack_160;
      auVar28._12_4_ = fStack_15c;
      auVar188 = maxps(auVar28,auVar193);
      auVar93._0_4_ = fVar253 * fVar154 + fVar271 * (float)local_5b8._4_4_;
      auVar93._4_4_ = fVar257 * fVar154 + fVar276 * (float)local_5b8._4_4_;
      auVar93._8_4_ = fVar266 * fVar154 + fVar279 * (float)local_5b8._4_4_;
      auVar93._12_4_ = fVar270 * fVar154 + fVar282 * (float)local_5b8._4_4_;
      auVar285._0_4_ = fVar284 * local_428 + auVar93._0_4_;
      auVar285._4_4_ = local_458 * fStack_424 + auVar93._4_4_;
      auVar285._8_4_ = fStack_454 * fStack_420 + auVar93._8_4_;
      auVar285._12_4_ = fStack_450 * fStack_41c + auVar93._12_4_;
      auVar77 = rcpps(auVar93,auVar285);
      fVar234 = auVar77._0_4_;
      fVar240 = auVar77._4_4_;
      fVar241 = auVar77._8_4_;
      fVar242 = auVar77._12_4_;
      uVar60 = (uint)DAT_01fec6c0;
      uVar62 = DAT_01fec6c0._4_4_;
      uVar64 = DAT_01fec6c0._8_4_;
      uVar66 = DAT_01fec6c0._12_4_;
      bVar8 = (float)((uint)auVar285._0_4_ & uVar60) < 1e-18;
      bVar9 = (float)((uint)auVar285._4_4_ & uVar62) < 1e-18;
      bVar10 = (float)((uint)auVar285._8_4_ & uVar64) < 1e-18;
      bVar11 = (float)((uint)auVar285._12_4_ & uVar66) < 1e-18;
      fVar210 = ((1.0 - auVar285._0_4_ * fVar234) * fVar234 + fVar234) *
                -(fVar210 * fVar284 + local_468 * fVar253 + local_478 * fVar271);
      fVar211 = ((1.0 - auVar285._4_4_ * fVar240) * fVar240 + fVar240) *
                -(fVar211 * local_458 + fStack_464 * fVar257 + fStack_474 * fVar276);
      fVar232 = ((1.0 - auVar285._8_4_ * fVar241) * fVar241 + fVar241) *
                -(fVar232 * fStack_454 + fStack_460 * fVar266 + fStack_470 * fVar279);
      fVar233 = ((1.0 - auVar285._12_4_ * fVar242) * fVar242 + fVar242) *
                -(fVar233 * fStack_450 + fStack_45c * fVar270 + fStack_46c * fVar282);
      uVar59 = -(uint)(auVar285._0_4_ < 0.0 || bVar8);
      uVar61 = -(uint)(auVar285._4_4_ < 0.0 || bVar9);
      uVar63 = -(uint)(auVar285._8_4_ < 0.0 || bVar10);
      uVar65 = -(uint)(auVar285._12_4_ < 0.0 || bVar11);
      auVar195._0_8_ = CONCAT44(uVar61,uVar59) & 0xff800000ff800000;
      auVar195._8_4_ = uVar63 & 0xff800000;
      auVar195._12_4_ = uVar65 & 0xff800000;
      auVar94._0_4_ = ~uVar59 & (uint)fVar210;
      auVar94._4_4_ = ~uVar61 & (uint)fVar211;
      auVar94._8_4_ = ~uVar63 & (uint)fVar232;
      auVar94._12_4_ = ~uVar65 & (uint)fVar233;
      auVar188 = maxps(auVar188,auVar94 | auVar195);
      uVar59 = -(uint)(0.0 < auVar285._0_4_ || bVar8);
      uVar61 = -(uint)(0.0 < auVar285._4_4_ || bVar9);
      uVar63 = -(uint)(0.0 < auVar285._8_4_ || bVar10);
      uVar65 = -(uint)(0.0 < auVar285._12_4_ || bVar11);
      auVar95._0_8_ = CONCAT44(uVar61,uVar59) & 0x7f8000007f800000;
      auVar95._8_4_ = uVar63 & 0x7f800000;
      auVar95._12_4_ = uVar65 & 0x7f800000;
      auVar286._0_4_ = ~uVar59 & (uint)fVar210;
      auVar286._4_4_ = ~uVar61 & (uint)fVar211;
      auVar286._8_4_ = ~uVar63 & (uint)fVar232;
      auVar286._12_4_ = ~uVar65 & (uint)fVar233;
      auVar189 = minps(auVar189,auVar286 | auVar95);
      auVar124._0_4_ = (0.0 - fVar305) * -fVar257 + (0.0 - fVar297) * -fVar276;
      auVar124._4_4_ = (0.0 - fVar306) * -fVar266 + (0.0 - fVar298) * -fVar279;
      auVar124._8_4_ = (0.0 - fVar307) * -fVar270 + (0.0 - fVar299) * -fVar282;
      auVar124._12_4_ = 0x80000000;
      auVar301._0_4_ =
           -local_458 * local_428 + -fVar257 * fVar154 + -fVar276 * (float)local_5b8._4_4_;
      auVar301._4_4_ =
           -fStack_454 * fStack_424 + -fVar266 * fVar154 + -fVar279 * (float)local_5b8._4_4_;
      auVar301._8_4_ =
           -fStack_450 * fStack_420 + -fVar270 * fVar154 + -fVar282 * (float)local_5b8._4_4_;
      auVar301._12_4_ = fStack_41c * -0.0 + fVar154 * -0.0 + (float)local_5b8._4_4_ * -0.0;
      auVar77 = rcpps(auVar124,auVar301);
      fVar210 = auVar77._0_4_;
      fVar211 = auVar77._4_4_;
      fVar232 = auVar77._8_4_;
      fVar233 = auVar77._12_4_;
      bVar8 = (float)((uint)auVar301._0_4_ & uVar60) < 1e-18;
      bVar9 = (float)((uint)auVar301._4_4_ & uVar62) < 1e-18;
      bVar10 = (float)((uint)auVar301._8_4_ & uVar64) < 1e-18;
      bVar11 = (float)((uint)auVar301._12_4_ & uVar66) < 1e-18;
      fVar210 = (((float)DAT_01feca10 - auVar301._0_4_ * fVar210) * fVar210 + fVar210) *
                -((0.0 - fVar281) * -local_458 + auVar124._0_4_);
      fVar211 = ((DAT_01feca10._4_4_ - auVar301._4_4_ * fVar211) * fVar211 + fVar211) *
                -((0.0 - fVar255) * -fStack_454 + auVar124._4_4_);
      fVar232 = ((DAT_01feca10._8_4_ - auVar301._8_4_ * fVar232) * fVar232 + fVar232) *
                -((0.0 - fVar256) * -fStack_450 + auVar124._8_4_);
      fVar233 = ((DAT_01feca10._12_4_ - auVar301._12_4_ * fVar233) * fVar233 + fVar233) * 0.0;
      uVar59 = -(uint)(auVar301._0_4_ < 0.0 || bVar8);
      uVar61 = -(uint)(auVar301._4_4_ < 0.0 || bVar9);
      uVar63 = -(uint)(auVar301._8_4_ < 0.0 || bVar10);
      uVar65 = -(uint)(auVar301._12_4_ < 0.0 || bVar11);
      auVar125._0_8_ = CONCAT44(uVar61,uVar59) & 0xff800000ff800000;
      auVar125._8_4_ = uVar63 & 0xff800000;
      auVar125._12_4_ = uVar65 & 0xff800000;
      auVar96._0_4_ = ~uVar59 & (uint)fVar210;
      auVar96._4_4_ = ~uVar61 & (uint)fVar211;
      auVar96._8_4_ = ~uVar63 & (uint)fVar232;
      auVar96._12_4_ = ~uVar65 & (uint)fVar233;
      auVar77 = maxps(auVar188,auVar96 | auVar125);
      uVar59 = -(uint)(0.0 < auVar301._0_4_ || bVar8);
      uVar61 = -(uint)(0.0 < auVar301._4_4_ || bVar9);
      uVar63 = -(uint)(0.0 < auVar301._8_4_ || bVar10);
      uVar65 = -(uint)(0.0 < auVar301._12_4_ || bVar11);
      auVar247._0_8_ = CONCAT44(uVar61,uVar59) & 0x7f8000007f800000;
      auVar247._8_4_ = uVar63 & 0x7f800000;
      auVar247._12_4_ = uVar65 & 0x7f800000;
      auVar302._0_4_ = ~uVar59 & (uint)fVar210;
      auVar302._4_4_ = ~uVar61 & (uint)fVar211;
      auVar302._8_4_ = ~uVar63 & (uint)fVar232;
      auVar302._12_4_ = ~uVar65 & (uint)fVar233;
      local_1c8 = minps(auVar189,auVar302 | auVar247);
      fVar210 = auVar77._12_4_;
      fVar211 = auVar77._0_4_;
      fVar232 = auVar77._4_4_;
      fVar233 = auVar77._8_4_;
      auVar287._0_4_ = -(uint)(fVar211 <= local_1c8._0_4_) & auVar160._0_4_;
      auVar287._4_4_ = -(uint)(fVar232 <= local_1c8._4_4_) & auVar160._4_4_;
      auVar287._8_4_ = -(uint)(fVar233 <= local_1c8._8_4_) & auVar160._8_4_;
      auVar287._12_4_ = -(uint)(fVar210 <= local_1c8._12_4_) & auVar160._12_4_;
      iVar45 = movmskps(iVar45,auVar287);
      lVar50 = CONCAT44(uVar54,iVar45);
      if (iVar45 != 0) {
        auVar21._4_4_ = fStack_4a4;
        auVar21._0_4_ = local_4a8;
        auVar21._8_4_ = fStack_4a0;
        auVar21._12_4_ = fStack_49c;
        auVar188 = maxps(ZEXT816(0),auVar21);
        auVar25._4_4_ = local_398[1];
        auVar25._0_4_ = local_398[0];
        auVar25._8_4_ = local_398[2];
        auVar25._12_4_ = local_398[3];
        auVar189 = minps(auVar25,_DAT_01feca10);
        auVar189 = maxps(auVar189,ZEXT816(0));
        auVar24._4_4_ = local_3a8[1];
        auVar24._0_4_ = local_3a8[0];
        auVar24._8_4_ = local_3a8[2];
        auVar24._12_4_ = local_3a8[3];
        auVar158 = minps(auVar24,_DAT_01feca10);
        auVar158 = maxps(auVar158,ZEXT816(0));
        local_398[0] = (auVar189._0_4_ + (float)DAT_01ff1e00) * 0.25 * local_488 + local_4c8;
        local_398[1] = (auVar189._4_4_ + DAT_01ff1e00._4_4_) * 0.25 * local_488 + local_4c8;
        local_398[2] = (auVar189._8_4_ + DAT_01ff1e00._8_4_) * 0.25 * local_488 + local_4c8;
        local_398[3] = (auVar189._12_4_ + DAT_01ff1e00._12_4_) * 0.25 * local_488 + local_4c8;
        fVar234 = 0.0;
        fVar240 = 0.0;
        fVar241 = 0.0;
        fVar242 = 0.0;
        local_3a8[0] = (auVar158._0_4_ + (float)DAT_01ff1e00) * 0.25 * local_488 + local_4c8;
        local_3a8[1] = (auVar158._4_4_ + DAT_01ff1e00._4_4_) * 0.25 * local_488 + local_4c8;
        local_3a8[2] = (auVar158._8_4_ + DAT_01ff1e00._8_4_) * 0.25 * local_488 + local_4c8;
        local_3a8[3] = (auVar158._12_4_ + DAT_01ff1e00._12_4_) * 0.25 * local_488 + local_4c8;
        auVar144._0_4_ = fVar170 - auVar188._0_4_ * auVar188._0_4_;
        auVar144._4_4_ = fVar183 - auVar188._4_4_ * auVar188._4_4_;
        auVar144._8_4_ = fVar184 - auVar188._8_4_ * auVar188._8_4_;
        auVar144._12_4_ = fVar209 - auVar188._12_4_ * auVar188._12_4_;
        auVar175._0_4_ = (float)local_4f8._0_4_ - local_3d8 * auVar144._0_4_;
        auVar175._4_4_ = (float)local_4f8._4_4_ - fStack_3d4 * auVar144._4_4_;
        auVar175._8_4_ = fStack_4f0 - fStack_3d0 * auVar144._8_4_;
        auVar175._12_4_ = fStack_4ec - fStack_3cc * auVar144._12_4_;
        local_4f8._4_4_ = -(uint)(0.0 <= auVar175._4_4_);
        local_4f8._0_4_ = -(uint)(0.0 <= auVar175._0_4_);
        fStack_4f0 = (float)-(uint)(0.0 <= auVar175._8_4_);
        fStack_4ec = (float)-(uint)(0.0 <= auVar175._12_4_);
        iVar45 = movmskps(iVar45,_local_4f8);
        if (iVar45 == 0) {
          fVar244 = 0.0;
          fVar245 = 0.0;
          fVar246 = 0.0;
          fVar253 = 0.0;
          fVar69 = 0.0;
          fVar137 = 0.0;
          fVar138 = 0.0;
          fVar139 = 0.0;
          fVar155 = 0.0;
          fVar169 = 0.0;
          fVar183 = 0.0;
          fVar209 = 0.0;
          fVar153 = 0.0;
          fVar168 = 0.0;
          fVar170 = 0.0;
          fVar184 = 0.0;
          _local_578 = ZEXT816(0);
          iVar45 = 0;
          auVar231 = _DAT_01feba00;
          auVar239 = _DAT_01feb9f0;
        }
        else {
          auVar189 = sqrtps(_DAT_01ff1e00,auVar175);
          auVar126._0_4_ = (float)local_438._0_4_ + (float)local_438._0_4_;
          auVar126._4_4_ = (float)local_438._4_4_ + (float)local_438._4_4_;
          auVar126._8_4_ = fStack_430 + fStack_430;
          auVar126._12_4_ = fStack_42c + fStack_42c;
          auVar188 = rcpps(auVar144,auVar126);
          fVar254 = auVar188._0_4_;
          fVar257 = auVar188._4_4_;
          fVar264 = auVar188._8_4_;
          fVar266 = auVar188._12_4_;
          fVar254 = ((float)DAT_01feca10 - auVar126._0_4_ * fVar254) * fVar254 + fVar254;
          fVar257 = (DAT_01feca10._4_4_ - auVar126._4_4_ * fVar257) * fVar257 + fVar257;
          fVar264 = (DAT_01feca10._8_4_ - auVar126._8_4_ * fVar264) * fVar264 + fVar264;
          fVar266 = (DAT_01feca10._12_4_ - auVar126._12_4_ * fVar266) * fVar266 + fVar266;
          fVar268 = (-fVar153 - auVar189._0_4_) * fVar254;
          fVar270 = (-fVar155 - auVar189._4_4_) * fVar257;
          fVar275 = (-fVar168 - auVar189._8_4_) * fVar264;
          fVar265 = (-fVar169 - auVar189._12_4_) * fVar266;
          fVar254 = (auVar189._0_4_ - fVar153) * fVar254;
          fVar257 = (auVar189._4_4_ - fVar155) * fVar257;
          fVar264 = (auVar189._8_4_ - fVar168) * fVar264;
          fVar266 = (auVar189._12_4_ - fVar169) * fVar266;
          fVar234 = (local_198 * fVar268 + (float)local_3c8._0_4_) * fVar69;
          fVar240 = (fStack_194 * fVar270 + (float)local_3c8._4_4_) * fVar137;
          fVar241 = (fStack_190 * fVar275 + (float)local_3c8._8_4_) * fVar138;
          fVar242 = (fStack_18c * fVar265 + (float)local_3c8._12_4_) * fVar139;
          fVar155 = local_428 * fVar268 - ((float)local_4e8._0_4_ * fVar234 + fVar278);
          fVar169 = fStack_424 * fVar270 - ((float)local_4e8._4_4_ * fVar240 + fVar281);
          fVar183 = fStack_420 * fVar275 - (fStack_4e0 * fVar241 + fVar255);
          fVar209 = fStack_41c * fVar265 - (fStack_4dc * fVar242 + fVar256);
          fVar153 = fVar154 * fVar268 - (local_4b8 * fVar234 + fVar300);
          fVar168 = fVar154 * fVar270 - (fStack_4b4 * fVar240 + fVar305);
          fVar170 = fVar154 * fVar275 - (fStack_4b0 * fVar241 + fVar306);
          fVar184 = fVar154 * fVar265 - (fStack_4ac * fVar242 + fVar307);
          local_578._4_4_ =
               (float)local_5b8._4_4_ * fVar270 - (fVar240 * (float)local_4d8._4_4_ + fVar297);
          local_578._0_4_ =
               (float)local_5b8._4_4_ * fVar268 - (fVar234 * (float)local_4d8._0_4_ + fVar292);
          fStack_570 = (float)local_5b8._4_4_ * fVar275 - (fVar241 * fStack_4d0 + fVar298);
          fStack_56c = (float)local_5b8._4_4_ * fVar265 - (fVar242 * fStack_4cc + fVar299);
          fVar69 = (local_198 * fVar254 + (float)local_3c8._0_4_) * fVar69;
          fVar137 = (fStack_194 * fVar257 + (float)local_3c8._4_4_) * fVar137;
          fVar138 = (fStack_190 * fVar264 + (float)local_3c8._8_4_) * fVar138;
          fVar139 = (fStack_18c * fVar266 + (float)local_3c8._12_4_) * fVar139;
          fVar234 = local_428 * fVar254 - ((float)local_4e8._0_4_ * fVar69 + fVar278);
          fVar240 = fStack_424 * fVar257 - ((float)local_4e8._4_4_ * fVar137 + fVar281);
          fVar241 = fStack_420 * fVar264 - (fStack_4e0 * fVar138 + fVar255);
          fVar242 = fStack_41c * fVar266 - (fStack_4dc * fVar139 + fVar256);
          fVar244 = fVar154 * fVar254 - (local_4b8 * fVar69 + fVar300);
          fVar245 = fVar154 * fVar257 - (fStack_4b4 * fVar137 + fVar305);
          fVar246 = fVar154 * fVar264 - (fStack_4b0 * fVar138 + fVar306);
          fVar253 = fVar154 * fVar266 - (fStack_4ac * fVar139 + fVar307);
          bVar8 = 0.0 <= auVar175._0_4_;
          uVar59 = -(uint)bVar8;
          bVar9 = 0.0 <= auVar175._4_4_;
          uVar61 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar175._8_4_;
          uVar63 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar175._12_4_;
          uVar65 = -(uint)bVar11;
          fVar69 = (float)local_5b8._4_4_ * fVar254 - (fVar69 * (float)local_4d8._0_4_ + fVar292);
          fVar137 = (float)local_5b8._4_4_ * fVar257 - (fVar137 * (float)local_4d8._4_4_ + fVar297);
          fVar138 = (float)local_5b8._4_4_ * fVar264 - (fVar138 * fStack_4d0 + fVar298);
          fVar139 = (float)local_5b8._4_4_ * fVar266 - (fVar139 * fStack_4cc + fVar299);
          auVar230._0_4_ = (uint)fVar268 & uVar59;
          auVar230._4_4_ = (uint)fVar270 & uVar61;
          auVar230._8_4_ = (uint)fVar275 & uVar63;
          auVar230._12_4_ = (uint)fVar265 & uVar65;
          auVar239._0_8_ = CONCAT44(~uVar61,~uVar59) & 0x7f8000007f800000;
          auVar239._8_4_ = ~uVar63 & 0x7f800000;
          auVar239._12_4_ = ~uVar65 & 0x7f800000;
          auVar239 = auVar239 | auVar230;
          auVar206._0_4_ = (uint)fVar254 & uVar59;
          auVar206._4_4_ = (uint)fVar257 & uVar61;
          auVar206._8_4_ = (uint)fVar264 & uVar63;
          auVar206._12_4_ = (uint)fVar266 & uVar65;
          auVar231._0_8_ = CONCAT44(~uVar61,~uVar59) & 0xff800000ff800000;
          auVar231._8_4_ = ~uVar63 & 0xff800000;
          auVar231._12_4_ = ~uVar65 & 0xff800000;
          auVar231 = auVar231 | auVar206;
          auVar97._0_8_ = local_1a8._0_8_ & 0x7fffffff7fffffff;
          auVar97._8_4_ = ABS(local_1a8._8_4_);
          auVar97._12_4_ = ABS(local_1a8._12_4_);
          auVar27._4_4_ = fStack_344;
          auVar27._0_4_ = local_348;
          auVar27._8_4_ = fStack_340;
          auVar27._12_4_ = fStack_33c;
          auVar188 = maxps(auVar27,auVar97);
          fVar254 = auVar188._0_4_ * 1.9073486e-06;
          fVar257 = auVar188._4_4_ * 1.9073486e-06;
          fVar264 = auVar188._8_4_ * 1.9073486e-06;
          fVar266 = auVar188._12_4_ * 1.9073486e-06;
          auVar207._0_4_ = -(uint)(ABS((float)local_438._0_4_) < fVar254 && bVar8);
          auVar207._4_4_ = -(uint)(ABS((float)local_438._4_4_) < fVar257 && bVar9);
          auVar207._8_4_ = -(uint)(ABS(fStack_430) < fVar264 && bVar10);
          auVar207._12_4_ = -(uint)(ABS(fStack_42c) < fVar266 && bVar11);
          iVar45 = movmskps(iVar45,auVar207);
          if (iVar45 != 0) {
            uVar59 = -(uint)(auVar144._0_4_ <= 0.0);
            uVar61 = -(uint)(auVar144._4_4_ <= 0.0);
            uVar63 = -(uint)(auVar144._8_4_ <= 0.0);
            uVar65 = -(uint)(auVar144._12_4_ <= 0.0);
            auVar251._0_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar207._0_4_;
            auVar251._4_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar207._4_4_;
            auVar251._8_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar207._8_4_;
            auVar251._12_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar207._12_4_;
            auVar243._0_4_ = ~auVar207._0_4_ & auVar239._0_4_;
            auVar243._4_4_ = ~auVar207._4_4_ & auVar239._4_4_;
            auVar243._8_4_ = ~auVar207._8_4_ & auVar239._8_4_;
            auVar243._12_4_ = ~auVar207._12_4_ & auVar239._12_4_;
            auVar239 = auVar243 | auVar251;
            auVar252._0_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar207._0_4_;
            auVar252._4_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar207._4_4_;
            auVar252._8_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar207._8_4_;
            auVar252._12_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar207._12_4_;
            auVar208._0_4_ = ~auVar207._0_4_ & auVar231._0_4_;
            auVar208._4_4_ = ~auVar207._4_4_ & auVar231._4_4_;
            auVar208._8_4_ = ~auVar207._8_4_ & auVar231._8_4_;
            auVar208._12_4_ = ~auVar207._12_4_ & auVar231._12_4_;
            auVar231 = auVar208 | auVar252;
            local_4f8._4_4_ =
                 -(uint)((fVar257 <= ABS((float)local_438._4_4_) || auVar144._4_4_ <= 0.0) && bVar9)
            ;
            local_4f8._0_4_ =
                 -(uint)((fVar254 <= ABS((float)local_438._0_4_) || auVar144._0_4_ <= 0.0) && bVar8)
            ;
            fStack_4f0 = (float)-(uint)((fVar264 <= ABS(fStack_430) || auVar144._8_4_ <= 0.0) &&
                                       bVar10);
            fStack_4ec = (float)-(uint)((fVar266 <= ABS(fStack_42c) || auVar144._12_4_ <= 0.0) &&
                                       bVar11);
          }
        }
        local_4d8._4_4_ =
             -(uint)(0.3 <= (float)((uint)(fVar240 * fStack_424 +
                                          fVar245 * fVar154 + fVar137 * (float)local_5b8._4_4_) &
                                   uVar62));
        local_4d8._0_4_ =
             -(uint)(0.3 <= (float)((uint)(fVar234 * local_428 +
                                          fVar244 * fVar154 + fVar69 * (float)local_5b8._4_4_) &
                                   uVar60));
        fStack_4d0 = (float)-(uint)(0.3 <= (float)((uint)(fVar241 * fStack_420 +
                                                         fVar246 * fVar154 +
                                                         fVar138 * (float)local_5b8._4_4_) & uVar64)
                                   );
        fStack_4cc = (float)-(uint)(0.3 <= (float)((uint)(fVar242 * fStack_41c +
                                                         fVar253 * fVar154 +
                                                         fVar139 * (float)local_5b8._4_4_) & uVar66)
                                   );
        _local_118 = auVar77;
        local_108 = minps(local_1c8,auVar239);
        _local_1d8 = maxps(auVar77,auVar231);
        local_3c8._0_4_ = -(uint)(fVar211 <= local_108._0_4_) & auVar287._0_4_;
        local_3c8._4_4_ = -(uint)(fVar232 <= local_108._4_4_) & auVar287._4_4_;
        local_3c8._8_4_ = -(uint)(fVar233 <= local_108._8_4_) & auVar287._8_4_;
        local_3c8._12_4_ = -(uint)(fVar210 <= local_108._12_4_) & auVar287._12_4_;
        local_3e8 = local_3c8;
        local_3f8._0_8_ =
             CONCAT44(-(uint)(local_1d8._4_4_ <= local_1c8._4_4_) & auVar287._4_4_,
                      -(uint)(local_1d8._0_4_ <= local_1c8._0_4_) & auVar287._0_4_);
        local_3f8._8_4_ = -(uint)(local_1d8._8_4_ <= local_1c8._8_4_) & auVar287._8_4_;
        local_3f8._12_4_ = -(uint)(local_1d8._12_4_ <= local_1c8._12_4_) & auVar287._12_4_;
        auVar98._8_4_ = local_3f8._8_4_;
        auVar98._0_8_ = local_3f8._0_8_;
        auVar98._12_4_ = local_3f8._12_4_;
        iVar45 = movmskps(iVar45,auVar98 | local_3c8);
        lVar50 = CONCAT44(uVar54,iVar45);
        if (iVar45 != 0) {
          _local_438 = local_3f8;
          _local_4e8 = _local_1d8;
          local_3d8 = (float)(int)local_580;
          fStack_3d4 = (float)(int)local_580;
          fStack_3d0 = (float)(int)local_580;
          fStack_3cc = (float)(int)local_580;
          local_578._0_4_ =
               -(uint)((int)local_580 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_578._0_4_ *
                                                            (float)local_5b8._4_4_ +
                                                            fVar153 * fVar154 + fVar155 * local_428)
                                                    & uVar60)) & local_4f8._0_4_) << 0x1f) >> 0x1f)
                      + 4);
          local_578._4_4_ =
               -(uint)((int)local_580 <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_578._4_4_ *
                                                            (float)local_5b8._4_4_ +
                                                            fVar168 * fVar154 + fVar169 * fStack_424
                                                           ) & uVar62)) & local_4f8._4_4_) << 0x1f)
                      >> 0x1f) + 4);
          fStack_570 = (float)-(uint)((int)local_580 <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_570 *
                                                                           (float)local_5b8._4_4_ +
                                                                           fVar170 * fVar154 +
                                                                          fVar183 * fStack_420) &
                                                                   uVar64)) & (uint)fStack_4f0) <<
                                           0x1f) >> 0x1f) + 4);
          fStack_56c = (float)-(uint)((int)local_580 <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_56c *
                                                                           (float)local_5b8._4_4_ +
                                                                           fVar184 * fVar154 +
                                                                          fVar209 * fStack_41c) &
                                                                   uVar66)) & (uint)fStack_4ec) <<
                                           0x1f) >> 0x1f) + 4);
          local_3e8 = ~_local_578 & local_3c8;
          iVar45 = movmskps(iVar45,local_3e8);
          auVar249 = _local_5b8;
          auVar188 = _DAT_01fec6c0;
          if (iVar45 != 0) {
            local_4b8 = local_568 + fVar211;
            fStack_4b4 = fStack_564 + fVar232;
            fStack_4b0 = fStack_560 + fVar233;
            fStack_4ac = fStack_55c + fVar210;
            do {
              auVar158 = ~local_3e8 & _DAT_01feb9f0 | local_3e8 & auVar77;
              auVar161._4_4_ = auVar158._0_4_;
              auVar161._0_4_ = auVar158._4_4_;
              auVar161._8_4_ = auVar158._12_4_;
              auVar161._12_4_ = auVar158._8_4_;
              auVar189 = minps(auVar161,auVar158);
              auVar127._0_8_ = auVar189._8_8_;
              auVar127._8_4_ = auVar189._0_4_;
              auVar127._12_4_ = auVar189._4_4_;
              auVar189 = minps(auVar127,auVar189);
              auVar128._0_8_ =
                   CONCAT44(-(uint)(auVar189._4_4_ == auVar158._4_4_) & local_3e8._4_4_,
                            -(uint)(auVar189._0_4_ == auVar158._0_4_) & local_3e8._0_4_);
              auVar128._8_4_ = -(uint)(auVar189._8_4_ == auVar158._8_4_) & local_3e8._8_4_;
              auVar128._12_4_ = -(uint)(auVar189._12_4_ == auVar158._12_4_) & local_3e8._12_4_;
              iVar45 = movmskps(iVar45,auVar128);
              auVar99 = local_3e8;
              if (iVar45 != 0) {
                auVar99._8_4_ = auVar128._8_4_;
                auVar99._0_8_ = auVar128._0_8_;
                auVar99._12_4_ = auVar128._12_4_;
              }
              uVar46 = movmskps(iVar45,auVar99);
              lVar50 = 0;
              if (CONCAT44(uVar54,uVar46) != 0) {
                for (; (CONCAT44(uVar54,uVar46) >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              *(undefined4 *)(local_3e8 + lVar50 * 4) = 0;
              fVar69 = local_398[lVar50];
              fVar137 = *(float *)(local_118 + lVar50 * 4);
              fVar138 = SQRT(fVar116);
              if ((float)local_418._0_4_ < 0.0) {
                fVar138 = sqrtf((float)local_418._0_4_);
                lVar50 = extraout_RAX;
                auVar188 = _DAT_01fec6c0;
              }
              auVar13._4_4_ = fVar113;
              auVar13._0_4_ = fVar112;
              auVar13._8_4_ = fVar114;
              auVar13._12_4_ = fVar115;
              auVar19._4_4_ = fStack_534;
              auVar19._0_4_ = local_538;
              auVar19._8_4_ = fStack_530;
              auVar19._12_4_ = fStack_52c;
              auVar158 = minps(auVar13,auVar19);
              auVar205 = maxps(auVar13,auVar19);
              auVar17._4_4_ = fStack_544;
              auVar17._0_4_ = local_548;
              auVar17._8_4_ = fStack_540;
              auVar17._12_4_ = fStack_53c;
              auVar15._4_4_ = fStack_554;
              auVar15._0_4_ = local_558;
              auVar15._8_4_ = fStack_550;
              auVar15._12_4_ = fStack_54c;
              auVar189 = minps(auVar17,auVar15);
              auVar158 = minps(auVar158,auVar189);
              auVar189 = maxps(auVar17,auVar15);
              auVar189 = maxps(auVar205,auVar189);
              auVar176._0_4_ = auVar158._0_4_ & auVar188._0_4_;
              auVar176._4_4_ = auVar158._4_4_ & auVar188._4_4_;
              auVar176._8_4_ = auVar158._8_4_ & auVar188._8_4_;
              auVar176._12_4_ = auVar158._12_4_ & auVar188._12_4_;
              local_4a8 = auVar189._12_4_;
              auVar100._0_4_ = auVar189._0_4_ & auVar188._0_4_;
              auVar100._4_4_ = auVar189._4_4_ & auVar188._4_4_;
              auVar100._8_4_ = auVar189._8_4_ & auVar188._8_4_;
              auVar100._12_4_ = (uint)local_4a8 & auVar188._12_4_;
              auVar188 = maxps(auVar176,auVar100);
              fVar139 = auVar188._4_4_;
              if (auVar188._4_4_ <= auVar188._0_4_) {
                fVar139 = auVar188._0_4_;
              }
              auVar177._8_8_ = auVar188._8_8_;
              auVar177._0_8_ = auVar188._8_8_;
              if (auVar188._8_4_ <= fVar139) {
                auVar177._0_4_ = fVar139;
              }
              fVar139 = auVar177._0_4_ * 1.9073486e-06;
              local_478 = fVar138 * 1.9073486e-06;
              fStack_4a4 = local_4a8;
              fStack_4a0 = local_4a8;
              fStack_49c = local_4a8;
              lVar58 = 5;
              do {
                auVar248._4_12_ = auVar249._4_12_;
                fVar183 = 1.0 - fVar69;
                fVar184 = fVar69 * fVar183;
                fVar168 = fVar183 * fVar183 * fVar183;
                fVar138 = fVar69 * fVar69 * fVar69;
                fVar155 = (fVar184 * fVar69 * 12.0 + fVar183 * fVar184 * 6.0 +
                          fVar138 * 4.0 + fVar168) * 0.16666667;
                fVar153 = fVar138 * 0.16666667;
                fVar169 = fVar168 * 0.16666667;
                fVar138 = (fVar183 * fVar184 * 12.0 + fVar184 * fVar69 * 6.0 +
                          fVar168 * 4.0 + fVar138) * 0.16666667;
                fVar170 = fVar169 * fVar115 +
                          fVar138 * fStack_52c + fVar155 * fStack_53c + fVar153 * fStack_54c;
                fVar185 = (fVar137 * (float)local_408._0_4_ + 0.0) -
                          (fVar169 * fVar112 +
                          fVar138 * local_538 + fVar155 * local_548 + fVar153 * local_558);
                fVar196 = (fVar137 * (float)local_408._4_4_ + 0.0) -
                          (fVar169 * fVar113 +
                          fVar138 * fStack_534 + fVar155 * fStack_544 + fVar153 * fStack_554);
                fVar197 = (fVar137 * fStack_400 + 0.0) -
                          (fVar169 * fVar114 +
                          fVar138 * fStack_530 + fVar155 * fStack_540 + fVar153 * fStack_550);
                fVar198 = (fVar137 * fStack_3fc + 0.0) - fVar170;
                fVar138 = fVar196 * fVar196;
                fVar153 = fVar197 * fVar197;
                fVar155 = fVar198 * fVar198;
                fVar168 = fVar138 + fVar185 * fVar185 + fVar153;
                fVar169 = fVar138 + fVar138 + fVar155;
                fVar153 = fVar138 + fVar153 + fVar153;
                fVar155 = fVar138 + fVar155 + fVar155;
                local_488 = fVar168;
                if (fVar168 < 0.0) {
                  fVar138 = sqrtf(fVar168);
                  auVar248._4_4_ = extraout_var._0_4_;
                  auVar248._0_4_ = fVar138;
                  auVar248._8_4_ = extraout_var._4_4_;
                  auVar248._12_4_ = extraout_var._8_4_;
                  lVar50 = extraout_RAX_00;
                }
                else {
                  auVar248._0_4_ = SQRT(fVar168);
                }
                fVar209 = -fVar183 * fVar183 * 0.5;
                fVar138 = (-fVar69 * fVar69 - fVar184 * 4.0) * 0.5;
                fVar184 = (fVar183 * fVar183 + fVar184 * 4.0) * 0.5;
                fVar233 = fVar69 * fVar69 * 0.5;
                fVar210 = fVar209 * fVar112 +
                          fVar138 * local_538 + fVar184 * local_548 + fVar233 * local_558;
                fVar211 = fVar209 * fVar113 +
                          fVar138 * fStack_534 + fVar184 * fStack_544 + fVar233 * fStack_554;
                fVar232 = fVar209 * fVar114 +
                          fVar138 * fStack_530 + fVar184 * fStack_540 + fVar233 * fStack_550;
                fVar184 = fVar209 * fVar115 +
                          fVar138 * fStack_52c + fVar184 * fStack_53c + fVar233 * fStack_54c;
                fVar138 = fVar69 - (fVar183 + fVar183);
                fVar209 = fVar183 - (fVar69 + fVar69);
                fVar233 = fVar183 * fVar112 +
                          fVar138 * local_538 + fVar209 * local_548 + fVar69 * local_558;
                fVar234 = fVar183 * fVar113 +
                          fVar138 * fStack_534 + fVar209 * fStack_544 + fVar69 * fStack_554;
                fVar183 = fVar183 * fVar114 +
                          fVar138 * fStack_530 + fVar209 * fStack_540 + fVar69 * fStack_550;
                fVar138 = fVar139;
                if (fVar139 <= local_478 * fVar137) {
                  fVar138 = local_478 * fVar137;
                }
                fVar209 = fVar211 * fVar211 + fVar210 * fVar210 + fVar232 * fVar232;
                auVar189 = ZEXT416((uint)fVar209);
                auVar188 = rsqrtss(ZEXT416((uint)fVar209),auVar189);
                fVar240 = auVar188._0_4_;
                fVar240 = fVar240 * fVar240 * fVar209 * -0.5 * fVar240 + fVar240 * 1.5;
                fVar241 = fVar183 * fVar232 + fVar234 * fVar211 + fVar233 * fVar210;
                auVar188 = rcpss(auVar189,auVar189);
                fVar242 = (2.0 - fVar209 * auVar188._0_4_) * auVar188._0_4_;
                fVar244 = fVar210 * fVar240;
                fVar245 = fVar211 * fVar240;
                fVar246 = fVar232 * fVar240;
                fVar253 = fVar184 * fVar240;
                if (fVar209 < 0.0) {
                  fVar254 = sqrtf(fVar209);
                  auVar248 = ZEXT416(auVar248._0_4_);
                  lVar50 = extraout_RAX_01;
                }
                else {
                  fVar254 = SQRT(fVar209);
                }
                fVar257 = fVar196 * fVar245;
                fVar264 = fVar197 * fVar246;
                fVar266 = fVar198 * fVar253;
                fVar268 = fVar257 + fVar185 * fVar244 + fVar264;
                fVar270 = fVar257 + fVar257 + fVar266;
                fVar264 = fVar257 + fVar264 + fVar264;
                fVar266 = fVar257 + fVar266 + fVar266;
                auVar249._0_4_ =
                     (auVar248._0_4_ + 1.0) * (fVar139 / fVar254) +
                     auVar248._0_4_ * fVar139 + fVar138;
                auVar249._4_12_ = auVar248._4_12_;
                fVar233 = fVar246 * -fVar232 + fVar245 * -fVar211 + fVar244 * -fVar210 +
                          fVar242 * (fVar209 * fVar183 - fVar241 * fVar232) * fVar240 * fVar197 +
                          fVar242 * (fVar209 * fVar234 - fVar241 * fVar211) * fVar240 * fVar196 +
                          fVar242 * (fVar209 * fVar233 - fVar241 * fVar210) * fVar240 * fVar185;
                local_458 = fStack_400 * fVar246 +
                            (float)local_408._4_4_ * fVar245 + (float)local_408._0_4_ * fVar244;
                fVar183 = fVar168 - fVar268 * fVar268;
                auVar101._0_8_ = CONCAT44(fVar169 - fVar270 * fVar270,fVar183);
                auVar101._8_4_ = fVar153 - fVar264 * fVar264;
                auVar101._12_4_ = fVar155 - fVar266 * fVar266;
                fVar209 = -fVar184 * fVar198;
                fStack_454 = fStack_3fc * fVar253;
                fStack_450 = fStack_400 * fVar246;
                fStack_44c = fStack_3fc * fVar253;
                local_468 = (fStack_400 * fVar197 +
                            (float)local_408._4_4_ * fVar196 + (float)local_408._0_4_ * fVar185) -
                            fVar268 * local_458;
                fStack_464 = fStack_3fc * fVar198;
                fStack_460 = fStack_400 * fVar197;
                fStack_45c = fStack_3fc * fVar198;
                auVar162._8_4_ = auVar101._8_4_;
                auVar162._0_8_ = auVar101._0_8_;
                auVar162._12_4_ = auVar101._12_4_;
                auVar188 = rsqrtss(auVar162,auVar101);
                fVar198 = auVar188._0_4_;
                auVar163._4_12_ = auVar188._4_12_;
                auVar163._0_4_ = fVar198 * fVar198 * fVar183 * -0.5 * fVar198 + fVar198 * 1.5;
                if (fVar183 < 0.0) {
                  _local_498 = auVar163;
                  fVar183 = sqrtf(fVar183);
                  auVar249 = ZEXT416((uint)auVar249._0_4_);
                  lVar50 = extraout_RAX_02;
                  auVar163 = _local_498;
                }
                else {
                  fVar183 = SQRT(fVar183);
                }
                auVar188 = _DAT_01fec6c0;
                auVar178._4_4_ = fVar169;
                auVar178._0_4_ = fVar168;
                auVar178._8_4_ = fVar153;
                auVar178._12_4_ = fVar155;
                fVar183 = fVar183 - fVar170;
                fVar153 = ((-fVar232 * fVar197 + -fVar211 * fVar196 + -fVar210 * fVar185) -
                          fVar268 * fVar233) * auVar163._0_4_ - fVar184;
                auVar22._4_4_ = fStack_464;
                auVar22._0_4_ = local_468;
                auVar22._8_4_ = fStack_460;
                auVar22._12_4_ = fStack_45c;
                auVar145._4_12_ = auVar22._4_12_;
                auVar145._0_4_ = local_468 * auVar163._0_4_;
                auVar289._0_8_ = CONCAT44(fVar209,fVar153) ^ 0x8000000080000000;
                auVar289._8_4_ = -fVar209;
                auVar289._12_4_ = fVar253 * -fVar184;
                auVar288._8_8_ = auVar289._8_8_;
                auVar288._0_8_ = CONCAT44(fVar233,fVar153) ^ 0x80000000;
                auVar303._0_4_ = fVar233 * auVar145._0_4_ - local_458 * fVar153;
                auVar147._0_8_ = auVar145._0_8_;
                auVar147._8_4_ = fStack_464;
                auVar147._12_4_ = -fStack_454;
                auVar146._8_8_ = auVar147._8_8_;
                auVar146._0_8_ = CONCAT44(local_458,auVar145._0_4_) ^ 0x8000000000000000;
                auVar303._4_4_ = auVar303._0_4_;
                auVar303._8_4_ = auVar303._0_4_;
                auVar303._12_4_ = auVar303._0_4_;
                auVar189 = divps(auVar146,auVar303);
                auVar158 = divps(auVar288,auVar303);
                fVar69 = fVar69 - (auVar189._4_4_ * fVar183 + auVar189._0_4_ * fVar268);
                fVar137 = fVar137 - (auVar158._4_4_ * fVar183 + auVar158._0_4_ * fVar268);
                lVar50 = CONCAT71((int7)((ulong)lVar50 >> 8),1);
                if (((float)((uint)fVar268 & (uint)DAT_01fec6c0) < auVar249._0_4_) &&
                   ((float)((uint)fVar183 & (uint)DAT_01fec6c0) <
                    local_4a8 * 1.9073486e-06 + fVar138 + auVar249._0_4_)) {
                  fVar137 = fVar137 + (float)local_3b8._0_4_;
                  if ((fVar68 <= fVar137) &&
                     (((fVar138 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar138 &&
                       (0.0 <= fVar69)) && (fVar69 <= 1.0)))) {
                    auVar189 = rsqrtss(auVar178,auVar178);
                    fVar153 = auVar189._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_588].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_BL = true;
                      }
                      else {
                        fVar153 = fVar153 * 1.5 + fVar153 * fVar153 * local_488 * -0.5 * fVar153;
                        fVar185 = fVar185 * fVar153;
                        fVar196 = fVar196 * fVar153;
                        fVar197 = fVar197 * fVar153;
                        fVar153 = fVar184 * fVar185 + fVar210;
                        fVar155 = fVar184 * fVar196 + fVar211;
                        fVar168 = fVar184 * fVar197 + fVar232;
                        fVar169 = fVar196 * fVar210 - fVar211 * fVar185;
                        fVar196 = fVar197 * fVar211 - fVar232 * fVar196;
                        fVar185 = fVar185 * fVar232 - fVar210 * fVar197;
                        local_248 = fVar196 * fVar155 - fVar185 * fVar153;
                        local_268._4_4_ = fVar185 * fVar168 - fVar169 * fVar155;
                        local_258 = fVar169 * fVar153 - fVar196 * fVar168;
                        local_268._0_4_ = local_268._4_4_;
                        fStack_260 = (float)local_268._4_4_;
                        fStack_25c = (float)local_268._4_4_;
                        fStack_254 = local_258;
                        fStack_250 = local_258;
                        fStack_24c = local_258;
                        fStack_244 = local_248;
                        fStack_240 = local_248;
                        fStack_23c = local_248;
                        local_238 = fVar69;
                        fStack_234 = fVar69;
                        fStack_230 = fVar69;
                        fStack_22c = fVar69;
                        local_228 = 0;
                        uStack_220 = 0;
                        local_218 = CONCAT44(uStack_364,local_368);
                        uStack_210 = CONCAT44(uStack_35c,uStack_360);
                        local_208 = CONCAT44(uStack_354,local_358);
                        uStack_200 = CONCAT44(uStack_34c,uStack_350);
                        local_1f8 = context->user->instID[0];
                        uStack_1f4 = local_1f8;
                        uStack_1f0 = local_1f8;
                        uStack_1ec = local_1f8;
                        local_1e8 = context->user->instPrimID[0];
                        uStack_1e4 = local_1e8;
                        uStack_1e0 = local_1e8;
                        uStack_1dc = local_1e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar137;
                        local_598 = *local_440;
                        uStack_590 = local_440[1];
                        _local_528 = (int *)&local_598;
                        uStack_520 = pGVar7->userPtr;
                        local_518 = context->user;
                        local_510 = ray;
                        local_508 = (RTCHitN *)local_268;
                        local_500 = 4;
                        p_Var48 = pGVar7->occlusionFilterN;
                        if (p_Var48 != (RTCFilterFunctionN)0x0) {
                          pRVar57 = (RTCFilterFunctionNArguments *)local_528;
                          p_Var48 = (RTCFilterFunctionN)(*p_Var48)(pRVar57);
                          auVar188 = _DAT_01fec6c0;
                        }
                        auVar102._0_4_ = -(uint)((int)local_598 == 0);
                        auVar102._4_4_ = -(uint)(local_598._4_4_ == 0);
                        auVar102._8_4_ = -(uint)((int)uStack_590 == 0);
                        auVar102._12_4_ = -(uint)(uStack_590._4_4_ == 0);
                        uVar59 = movmskps((int)p_Var48,auVar102);
                        pRVar47 = (RayK<4> *)(ulong)(uVar59 ^ 0xf);
                        if ((uVar59 ^ 0xf) == 0) {
                          auVar102 = auVar102 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var48 = context->args->filter;
                          if ((p_Var48 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar57 = (RTCFilterFunctionNArguments *)local_528;
                            (*p_Var48)(pRVar57);
                            auVar188 = _DAT_01fec6c0;
                          }
                          auVar129._0_4_ = -(uint)((int)local_598 == 0);
                          auVar129._4_4_ = -(uint)(local_598._4_4_ == 0);
                          auVar129._8_4_ = -(uint)((int)uStack_590 == 0);
                          auVar129._12_4_ = -(uint)(uStack_590._4_4_ == 0);
                          auVar102 = auVar129 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_510 + 0x80) =
                               ~auVar129 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_510 + 0x80) & auVar129;
                          pRVar47 = local_510;
                        }
                        auVar103._0_4_ = auVar102._0_4_ << 0x1f;
                        auVar103._4_4_ = auVar102._4_4_ << 0x1f;
                        auVar103._8_4_ = auVar102._8_4_ << 0x1f;
                        auVar103._12_4_ = auVar102._12_4_ << 0x1f;
                        iVar45 = movmskps((int)pRVar47,auVar103);
                        unaff_BL = iVar45 != 0;
                        if (!(bool)unaff_BL) {
                          *(float *)(ray + k * 4 + 0x80) = fVar138;
                        }
                      }
                      lVar50 = 0;
                      goto LAB_00b21d0b;
                    }
                  }
                  lVar50 = 0;
                  unaff_BL = 0;
                }
LAB_00b21d0b:
                if ((char)lVar50 == '\0') goto LAB_00b2201c;
                lVar58 = lVar58 + -1;
              } while (lVar58 != 0);
              unaff_BL = 0;
LAB_00b2201c:
              unaff_BL = unaff_BL & 1;
              fVar69 = *(float *)(ray + k * 4 + 0x80);
              local_3e8._0_4_ = -(uint)(local_4b8 <= fVar69) & local_3e8._0_4_;
              local_3e8._4_4_ = -(uint)(fStack_4b4 <= fVar69) & local_3e8._4_4_;
              local_3e8._8_4_ = -(uint)(fStack_4b0 <= fVar69) & local_3e8._8_4_;
              local_3e8._12_4_ = -(uint)(fStack_4ac <= fVar69) & local_3e8._12_4_;
              bVar52 = bVar52 | unaff_BL;
              uVar54 = (undefined4)((ulong)lVar50 >> 0x20);
              iVar45 = movmskps((int)lVar50,local_3e8);
            } while (iVar45 != 0);
          }
          auVar77 = _local_1d8;
          fVar69 = *(float *)(ray + k * 4 + 0x80);
          local_4e8._0_4_ = -(uint)((float)local_4e8._0_4_ + local_568 <= fVar69) & local_438._0_4_;
          local_4e8._4_4_ = -(uint)((float)local_4e8._4_4_ + fStack_564 <= fVar69) & local_438._4_4_
          ;
          fStack_4e0 = (float)(-(uint)(fStack_4e0 + fStack_560 <= fVar69) & (uint)fStack_430);
          fStack_4dc = (float)(-(uint)(fStack_4dc + fStack_55c <= fVar69) & (uint)fStack_42c);
          local_4d8._0_4_ =
               -(uint)((int)local_3d8 <
                      ((int)((local_4d8._0_4_ & local_4f8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4d8._4_4_ =
               -(uint)((int)fStack_3d4 <
                      ((int)((local_4d8._4_4_ & local_4f8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4d0 = (float)-(uint)((int)fStack_3d0 <
                                     ((int)(((uint)fStack_4d0 & (uint)fStack_4f0) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_4cc = (float)-(uint)((int)fStack_3cc <
                                     ((int)(((uint)fStack_4cc & (uint)fStack_4ec) << 0x1f) >> 0x1f)
                                     + 4);
          local_3f8 = ~_local_4d8 & _local_4e8;
          iVar45 = movmskps(iVar45,local_3f8);
          if (iVar45 != 0) {
            local_4b8 = local_568 + (float)local_1d8._0_4_;
            fStack_4b4 = fStack_564 + (float)local_1d8._4_4_;
            fStack_4b0 = fStack_560 + fStack_1d0;
            fStack_4ac = fStack_55c + fStack_1cc;
            do {
              auVar158 = ~local_3f8 & _DAT_01feb9f0 | local_3f8 & auVar77;
              auVar164._4_4_ = auVar158._0_4_;
              auVar164._0_4_ = auVar158._4_4_;
              auVar164._8_4_ = auVar158._12_4_;
              auVar164._12_4_ = auVar158._8_4_;
              auVar189 = minps(auVar164,auVar158);
              auVar130._0_8_ = auVar189._8_8_;
              auVar130._8_4_ = auVar189._0_4_;
              auVar130._12_4_ = auVar189._4_4_;
              auVar189 = minps(auVar130,auVar189);
              auVar131._0_8_ =
                   CONCAT44(-(uint)(auVar189._4_4_ == auVar158._4_4_) & local_3f8._4_4_,
                            -(uint)(auVar189._0_4_ == auVar158._0_4_) & local_3f8._0_4_);
              auVar131._8_4_ = -(uint)(auVar189._8_4_ == auVar158._8_4_) & local_3f8._8_4_;
              auVar131._12_4_ = -(uint)(auVar189._12_4_ == auVar158._12_4_) & local_3f8._12_4_;
              iVar45 = movmskps(iVar45,auVar131);
              auVar104 = local_3f8;
              if (iVar45 != 0) {
                auVar104._8_4_ = auVar131._8_4_;
                auVar104._0_8_ = auVar131._0_8_;
                auVar104._12_4_ = auVar131._12_4_;
              }
              uVar46 = movmskps(iVar45,auVar104);
              lVar50 = 0;
              if (CONCAT44(uVar54,uVar46) != 0) {
                for (; (CONCAT44(uVar54,uVar46) >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              *(undefined4 *)(local_3f8 + lVar50 * 4) = 0;
              fVar69 = local_3a8[lVar50];
              fVar137 = *(float *)(local_1c8 + lVar50 * 4);
              fVar138 = SQRT(fVar116);
              if ((float)local_418._0_4_ < 0.0) {
                fVar138 = sqrtf((float)local_418._0_4_);
                lVar50 = extraout_RAX_03;
                auVar188 = _DAT_01fec6c0;
              }
              auVar14._4_4_ = fVar113;
              auVar14._0_4_ = fVar112;
              auVar14._8_4_ = fVar114;
              auVar14._12_4_ = fVar115;
              auVar20._4_4_ = fStack_534;
              auVar20._0_4_ = local_538;
              auVar20._8_4_ = fStack_530;
              auVar20._12_4_ = fStack_52c;
              auVar158 = minps(auVar14,auVar20);
              auVar205 = maxps(auVar14,auVar20);
              auVar18._4_4_ = fStack_544;
              auVar18._0_4_ = local_548;
              auVar18._8_4_ = fStack_540;
              auVar18._12_4_ = fStack_53c;
              auVar16._4_4_ = fStack_554;
              auVar16._0_4_ = local_558;
              auVar16._8_4_ = fStack_550;
              auVar16._12_4_ = fStack_54c;
              auVar189 = minps(auVar18,auVar16);
              auVar158 = minps(auVar158,auVar189);
              auVar189 = maxps(auVar18,auVar16);
              auVar189 = maxps(auVar205,auVar189);
              auVar179._0_4_ = auVar158._0_4_ & auVar188._0_4_;
              auVar179._4_4_ = auVar158._4_4_ & auVar188._4_4_;
              auVar179._8_4_ = auVar158._8_4_ & auVar188._8_4_;
              auVar179._12_4_ = auVar158._12_4_ & auVar188._12_4_;
              local_4a8 = auVar189._12_4_;
              auVar105._0_4_ = auVar189._0_4_ & auVar188._0_4_;
              auVar105._4_4_ = auVar189._4_4_ & auVar188._4_4_;
              auVar105._8_4_ = auVar189._8_4_ & auVar188._8_4_;
              auVar105._12_4_ = (uint)local_4a8 & auVar188._12_4_;
              auVar188 = maxps(auVar179,auVar105);
              fVar139 = auVar188._4_4_;
              if (auVar188._4_4_ <= auVar188._0_4_) {
                fVar139 = auVar188._0_4_;
              }
              auVar180._8_8_ = auVar188._8_8_;
              auVar180._0_8_ = auVar188._8_8_;
              if (auVar188._8_4_ <= fVar139) {
                auVar180._0_4_ = fVar139;
              }
              fVar139 = auVar180._0_4_ * 1.9073486e-06;
              local_478 = fVar138 * 1.9073486e-06;
              fStack_4a4 = local_4a8;
              fStack_4a0 = local_4a8;
              fStack_49c = local_4a8;
              lVar58 = 5;
              do {
                auVar250._4_12_ = auVar249._4_12_;
                fVar183 = 1.0 - fVar69;
                fVar184 = fVar69 * fVar183;
                fVar168 = fVar183 * fVar183 * fVar183;
                fVar138 = fVar69 * fVar69 * fVar69;
                fVar155 = (fVar184 * fVar69 * 12.0 + fVar183 * fVar184 * 6.0 +
                          fVar138 * 4.0 + fVar168) * 0.16666667;
                fVar153 = fVar138 * 0.16666667;
                fVar169 = fVar168 * 0.16666667;
                fVar138 = (fVar183 * fVar184 * 12.0 + fVar184 * fVar69 * 6.0 +
                          fVar168 * 4.0 + fVar138) * 0.16666667;
                fVar170 = fVar169 * fVar115 +
                          fVar138 * fStack_52c + fVar155 * fStack_53c + fVar153 * fStack_54c;
                fVar185 = (fVar137 * (float)local_408._0_4_ + 0.0) -
                          (fVar169 * fVar112 +
                          fVar138 * local_538 + fVar155 * local_548 + fVar153 * local_558);
                fVar196 = (fVar137 * (float)local_408._4_4_ + 0.0) -
                          (fVar169 * fVar113 +
                          fVar138 * fStack_534 + fVar155 * fStack_544 + fVar153 * fStack_554);
                fVar197 = (fVar137 * fStack_400 + 0.0) -
                          (fVar169 * fVar114 +
                          fVar138 * fStack_530 + fVar155 * fStack_540 + fVar153 * fStack_550);
                fVar198 = (fVar137 * fStack_3fc + 0.0) - fVar170;
                fVar138 = fVar196 * fVar196;
                fVar153 = fVar197 * fVar197;
                fVar155 = fVar198 * fVar198;
                fVar168 = fVar138 + fVar185 * fVar185 + fVar153;
                fVar169 = fVar138 + fVar138 + fVar155;
                fVar153 = fVar138 + fVar153 + fVar153;
                fVar155 = fVar138 + fVar155 + fVar155;
                local_488 = fVar168;
                if (fVar168 < 0.0) {
                  fVar138 = sqrtf(fVar168);
                  auVar250._4_4_ = extraout_var_00._0_4_;
                  auVar250._0_4_ = fVar138;
                  auVar250._8_4_ = extraout_var_00._4_4_;
                  auVar250._12_4_ = extraout_var_00._8_4_;
                  lVar50 = extraout_RAX_04;
                }
                else {
                  auVar250._0_4_ = SQRT(fVar168);
                }
                fVar209 = -fVar183 * fVar183 * 0.5;
                fVar138 = (-fVar69 * fVar69 - fVar184 * 4.0) * 0.5;
                fVar184 = (fVar183 * fVar183 + fVar184 * 4.0) * 0.5;
                fVar233 = fVar69 * fVar69 * 0.5;
                fVar210 = fVar209 * fVar112 +
                          fVar138 * local_538 + fVar184 * local_548 + fVar233 * local_558;
                fVar211 = fVar209 * fVar113 +
                          fVar138 * fStack_534 + fVar184 * fStack_544 + fVar233 * fStack_554;
                fVar232 = fVar209 * fVar114 +
                          fVar138 * fStack_530 + fVar184 * fStack_540 + fVar233 * fStack_550;
                fVar184 = fVar209 * fVar115 +
                          fVar138 * fStack_52c + fVar184 * fStack_53c + fVar233 * fStack_54c;
                fVar138 = fVar69 - (fVar183 + fVar183);
                fVar209 = fVar183 - (fVar69 + fVar69);
                fVar233 = fVar183 * fVar112 +
                          fVar138 * local_538 + fVar209 * local_548 + fVar69 * local_558;
                fVar234 = fVar183 * fVar113 +
                          fVar138 * fStack_534 + fVar209 * fStack_544 + fVar69 * fStack_554;
                fVar183 = fVar183 * fVar114 +
                          fVar138 * fStack_530 + fVar209 * fStack_540 + fVar69 * fStack_550;
                fVar138 = fVar139;
                if (fVar139 <= local_478 * fVar137) {
                  fVar138 = local_478 * fVar137;
                }
                fVar209 = fVar211 * fVar211 + fVar210 * fVar210 + fVar232 * fVar232;
                auVar189 = ZEXT416((uint)fVar209);
                auVar188 = rsqrtss(ZEXT416((uint)fVar209),auVar189);
                fVar240 = auVar188._0_4_;
                fVar240 = fVar240 * fVar240 * fVar209 * -0.5 * fVar240 + fVar240 * 1.5;
                fVar241 = fVar183 * fVar232 + fVar234 * fVar211 + fVar233 * fVar210;
                auVar188 = rcpss(auVar189,auVar189);
                fVar242 = (2.0 - fVar209 * auVar188._0_4_) * auVar188._0_4_;
                fVar244 = fVar210 * fVar240;
                fVar245 = fVar211 * fVar240;
                fVar246 = fVar232 * fVar240;
                fVar253 = fVar184 * fVar240;
                if (fVar209 < 0.0) {
                  fVar254 = sqrtf(fVar209);
                  auVar250 = ZEXT416(auVar250._0_4_);
                  lVar50 = extraout_RAX_05;
                }
                else {
                  fVar254 = SQRT(fVar209);
                }
                fVar257 = fVar196 * fVar245;
                fVar264 = fVar197 * fVar246;
                fVar266 = fVar198 * fVar253;
                fVar268 = fVar257 + fVar185 * fVar244 + fVar264;
                fVar270 = fVar257 + fVar257 + fVar266;
                fVar264 = fVar257 + fVar264 + fVar264;
                fVar266 = fVar257 + fVar266 + fVar266;
                auVar249._0_4_ =
                     (auVar250._0_4_ + 1.0) * (fVar139 / fVar254) +
                     auVar250._0_4_ * fVar139 + fVar138;
                auVar249._4_12_ = auVar250._4_12_;
                fVar233 = fVar246 * -fVar232 + fVar245 * -fVar211 + fVar244 * -fVar210 +
                          fVar242 * (fVar209 * fVar183 - fVar241 * fVar232) * fVar240 * fVar197 +
                          fVar242 * (fVar209 * fVar234 - fVar241 * fVar211) * fVar240 * fVar196 +
                          fVar242 * (fVar209 * fVar233 - fVar241 * fVar210) * fVar240 * fVar185;
                local_458 = fStack_400 * fVar246 +
                            (float)local_408._4_4_ * fVar245 + (float)local_408._0_4_ * fVar244;
                fVar183 = fVar168 - fVar268 * fVar268;
                auVar106._0_8_ = CONCAT44(fVar169 - fVar270 * fVar270,fVar183);
                auVar106._8_4_ = fVar153 - fVar264 * fVar264;
                auVar106._12_4_ = fVar155 - fVar266 * fVar266;
                fVar209 = -fVar184 * fVar198;
                fStack_454 = fStack_3fc * fVar253;
                fStack_450 = fStack_400 * fVar246;
                fStack_44c = fStack_3fc * fVar253;
                local_468 = (fStack_400 * fVar197 +
                            (float)local_408._4_4_ * fVar196 + (float)local_408._0_4_ * fVar185) -
                            fVar268 * local_458;
                fStack_464 = fStack_3fc * fVar198;
                fStack_460 = fStack_400 * fVar197;
                fStack_45c = fStack_3fc * fVar198;
                auVar165._8_4_ = auVar106._8_4_;
                auVar165._0_8_ = auVar106._0_8_;
                auVar165._12_4_ = auVar106._12_4_;
                auVar188 = rsqrtss(auVar165,auVar106);
                fVar198 = auVar188._0_4_;
                auVar166._4_12_ = auVar188._4_12_;
                auVar166._0_4_ = fVar198 * fVar198 * fVar183 * -0.5 * fVar198 + fVar198 * 1.5;
                if (fVar183 < 0.0) {
                  _local_498 = auVar166;
                  fVar183 = sqrtf(fVar183);
                  auVar249 = ZEXT416((uint)auVar249._0_4_);
                  lVar50 = extraout_RAX_06;
                  auVar166 = _local_498;
                }
                else {
                  fVar183 = SQRT(fVar183);
                }
                auVar188 = _DAT_01fec6c0;
                auVar181._4_4_ = fVar169;
                auVar181._0_4_ = fVar168;
                auVar181._8_4_ = fVar153;
                auVar181._12_4_ = fVar155;
                fVar183 = fVar183 - fVar170;
                fVar153 = ((-fVar232 * fVar197 + -fVar211 * fVar196 + -fVar210 * fVar185) -
                          fVar268 * fVar233) * auVar166._0_4_ - fVar184;
                auVar23._4_4_ = fStack_464;
                auVar23._0_4_ = local_468;
                auVar23._8_4_ = fStack_460;
                auVar23._12_4_ = fStack_45c;
                auVar148._4_12_ = auVar23._4_12_;
                auVar148._0_4_ = local_468 * auVar166._0_4_;
                auVar291._0_8_ = CONCAT44(fVar209,fVar153) ^ 0x8000000080000000;
                auVar291._8_4_ = -fVar209;
                auVar291._12_4_ = fVar253 * -fVar184;
                auVar290._8_8_ = auVar291._8_8_;
                auVar290._0_8_ = CONCAT44(fVar233,fVar153) ^ 0x80000000;
                auVar304._0_4_ = fVar233 * auVar148._0_4_ - local_458 * fVar153;
                auVar150._0_8_ = auVar148._0_8_;
                auVar150._8_4_ = fStack_464;
                auVar150._12_4_ = -fStack_454;
                auVar149._8_8_ = auVar150._8_8_;
                auVar149._0_8_ = CONCAT44(local_458,auVar148._0_4_) ^ 0x8000000000000000;
                auVar304._4_4_ = auVar304._0_4_;
                auVar304._8_4_ = auVar304._0_4_;
                auVar304._12_4_ = auVar304._0_4_;
                auVar189 = divps(auVar149,auVar304);
                auVar158 = divps(auVar290,auVar304);
                fVar69 = fVar69 - (auVar189._4_4_ * fVar183 + auVar189._0_4_ * fVar268);
                fVar137 = fVar137 - (auVar158._4_4_ * fVar183 + auVar158._0_4_ * fVar268);
                lVar50 = CONCAT71((int7)((ulong)lVar50 >> 8),1);
                if (((float)((uint)fVar268 & (uint)DAT_01fec6c0) < auVar249._0_4_) &&
                   ((float)((uint)fVar183 & (uint)DAT_01fec6c0) <
                    local_4a8 * 1.9073486e-06 + fVar138 + auVar249._0_4_)) {
                  fVar137 = fVar137 + (float)local_3b8._0_4_;
                  if ((fVar68 <= fVar137) &&
                     (((fVar138 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar138 &&
                       (0.0 <= fVar69)) && (fVar69 <= 1.0)))) {
                    auVar189 = rsqrtss(auVar181,auVar181);
                    fVar153 = auVar189._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_588].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_BL = true;
                      }
                      else {
                        fVar153 = fVar153 * 1.5 + fVar153 * fVar153 * local_488 * -0.5 * fVar153;
                        fVar185 = fVar185 * fVar153;
                        fVar196 = fVar196 * fVar153;
                        fVar197 = fVar197 * fVar153;
                        fVar153 = fVar184 * fVar185 + fVar210;
                        fVar155 = fVar184 * fVar196 + fVar211;
                        fVar168 = fVar184 * fVar197 + fVar232;
                        fVar169 = fVar196 * fVar210 - fVar211 * fVar185;
                        fVar196 = fVar197 * fVar211 - fVar232 * fVar196;
                        fVar185 = fVar185 * fVar232 - fVar210 * fVar197;
                        local_248 = fVar196 * fVar155 - fVar185 * fVar153;
                        local_268._4_4_ = fVar185 * fVar168 - fVar169 * fVar155;
                        local_258 = fVar169 * fVar153 - fVar196 * fVar168;
                        local_268._0_4_ = local_268._4_4_;
                        fStack_260 = (float)local_268._4_4_;
                        fStack_25c = (float)local_268._4_4_;
                        fStack_254 = local_258;
                        fStack_250 = local_258;
                        fStack_24c = local_258;
                        fStack_244 = local_248;
                        fStack_240 = local_248;
                        fStack_23c = local_248;
                        local_238 = fVar69;
                        fStack_234 = fVar69;
                        fStack_230 = fVar69;
                        fStack_22c = fVar69;
                        local_228 = 0;
                        uStack_220 = 0;
                        local_218 = CONCAT44(uStack_364,local_368);
                        uStack_210 = CONCAT44(uStack_35c,uStack_360);
                        local_208 = CONCAT44(uStack_354,local_358);
                        uStack_200 = CONCAT44(uStack_34c,uStack_350);
                        local_1f8 = context->user->instID[0];
                        uStack_1f4 = local_1f8;
                        uStack_1f0 = local_1f8;
                        uStack_1ec = local_1f8;
                        local_1e8 = context->user->instPrimID[0];
                        uStack_1e4 = local_1e8;
                        uStack_1e0 = local_1e8;
                        uStack_1dc = local_1e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar137;
                        local_598 = *local_440;
                        uStack_590 = local_440[1];
                        _local_528 = (int *)&local_598;
                        uStack_520 = pGVar7->userPtr;
                        local_518 = context->user;
                        local_510 = ray;
                        local_508 = (RTCHitN *)local_268;
                        local_500 = 4;
                        p_Var48 = pGVar7->occlusionFilterN;
                        if (p_Var48 != (RTCFilterFunctionN)0x0) {
                          pRVar57 = (RTCFilterFunctionNArguments *)local_528;
                          p_Var48 = (RTCFilterFunctionN)(*p_Var48)(pRVar57);
                          auVar188 = _DAT_01fec6c0;
                        }
                        auVar107._0_4_ = -(uint)((int)local_598 == 0);
                        auVar107._4_4_ = -(uint)(local_598._4_4_ == 0);
                        auVar107._8_4_ = -(uint)((int)uStack_590 == 0);
                        auVar107._12_4_ = -(uint)(uStack_590._4_4_ == 0);
                        uVar59 = movmskps((int)p_Var48,auVar107);
                        pRVar47 = (RayK<4> *)(ulong)(uVar59 ^ 0xf);
                        if ((uVar59 ^ 0xf) == 0) {
                          auVar107 = auVar107 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var48 = context->args->filter;
                          if ((p_Var48 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar57 = (RTCFilterFunctionNArguments *)local_528;
                            (*p_Var48)(pRVar57);
                            auVar188 = _DAT_01fec6c0;
                          }
                          auVar132._0_4_ = -(uint)((int)local_598 == 0);
                          auVar132._4_4_ = -(uint)(local_598._4_4_ == 0);
                          auVar132._8_4_ = -(uint)((int)uStack_590 == 0);
                          auVar132._12_4_ = -(uint)(uStack_590._4_4_ == 0);
                          auVar107 = auVar132 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_510 + 0x80) =
                               ~auVar132 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_510 + 0x80) & auVar132;
                          pRVar47 = local_510;
                        }
                        auVar108._0_4_ = auVar107._0_4_ << 0x1f;
                        auVar108._4_4_ = auVar107._4_4_ << 0x1f;
                        auVar108._8_4_ = auVar107._8_4_ << 0x1f;
                        auVar108._12_4_ = auVar107._12_4_ << 0x1f;
                        iVar45 = movmskps((int)pRVar47,auVar108);
                        unaff_BL = iVar45 != 0;
                        if (!(bool)unaff_BL) {
                          *(float *)(ray + k * 4 + 0x80) = fVar138;
                        }
                      }
                      lVar50 = 0;
                      goto LAB_00b228c8;
                    }
                  }
                  lVar50 = 0;
                  unaff_BL = 0;
                }
LAB_00b228c8:
                if ((char)lVar50 == '\0') goto LAB_00b22be2;
                lVar58 = lVar58 + -1;
              } while (lVar58 != 0);
              unaff_BL = 0;
LAB_00b22be2:
              unaff_BL = unaff_BL & 1;
              fVar69 = *(float *)(ray + k * 4 + 0x80);
              local_3f8._0_4_ = -(uint)(local_4b8 <= fVar69) & local_3f8._0_4_;
              local_3f8._4_4_ = -(uint)(fStack_4b4 <= fVar69) & local_3f8._4_4_;
              local_3f8._8_4_ = -(uint)(fStack_4b0 <= fVar69) & local_3f8._8_4_;
              local_3f8._12_4_ = -(uint)(fStack_4ac <= fVar69) & local_3f8._12_4_;
              bVar52 = bVar52 | unaff_BL;
              uVar54 = (undefined4)((ulong)lVar50 >> 0x20);
              iVar45 = movmskps((int)lVar50,local_3f8);
            } while (iVar45 != 0);
          }
          fVar69 = *(float *)(ray + k * 4 + 0x80);
          auVar182._0_4_ =
               local_578._0_4_ & local_3c8._0_4_ &
               -(uint)(local_568 + (float)local_118._0_4_ <= fVar69);
          auVar182._4_4_ =
               local_578._4_4_ & local_3c8._4_4_ &
               -(uint)(fStack_564 + (float)local_118._4_4_ <= fVar69);
          auVar182._8_4_ =
               (uint)fStack_570 & local_3c8._8_4_ & -(uint)(fStack_560 + fStack_110 <= fVar69);
          auVar182._12_4_ =
               (uint)fStack_56c & local_3c8._12_4_ & -(uint)(fStack_55c + fStack_10c <= fVar69);
          auVar151._0_4_ =
               local_4d8._0_4_ & local_4e8._0_4_ &
               -(uint)(local_568 + (float)local_1d8._0_4_ <= fVar69);
          auVar151._4_4_ =
               local_4d8._4_4_ & local_4e8._4_4_ &
               -(uint)(fStack_564 + (float)local_1d8._4_4_ <= fVar69);
          auVar151._8_4_ =
               (uint)fStack_4d0 & (uint)fStack_4e0 & -(uint)(fStack_560 + fStack_1d0 <= fVar69);
          auVar151._12_4_ =
               (uint)fStack_4cc & (uint)fStack_4dc & -(uint)(fStack_55c + fStack_1cc <= fVar69);
          iVar45 = movmskps(iVar45,auVar151 | auVar182);
          lVar50 = CONCAT44(uVar54,iVar45);
          fVar185 = local_568;
          fVar196 = fStack_564;
          fVar197 = fStack_560;
          fVar198 = fStack_55c;
          if (iVar45 != 0) {
            lVar50 = uVar51 * 0x30;
            *(undefined1 (*) [16])(local_f8 + uVar51 * 0xc) = auVar151 | auVar182;
            afStack_e8[uVar51 * 0xc] =
                 (float)(~auVar182._0_4_ & local_1d8._0_4_ | local_118._0_4_ & auVar182._0_4_);
            afStack_e8[uVar51 * 0xc + 1] =
                 (float)(~auVar182._4_4_ & local_1d8._4_4_ | local_118._4_4_ & auVar182._4_4_);
            afStack_e8[uVar51 * 0xc + 2] =
                 (float)(~auVar182._8_4_ & (uint)fStack_1d0 | (uint)fStack_110 & auVar182._8_4_);
            afStack_e8[uVar51 * 0xc + 3] =
                 (float)(~auVar182._12_4_ & (uint)fStack_1cc | (uint)fStack_10c & auVar182._12_4_);
            local_d0[uVar51 * 0xc + -2] = local_4c8;
            local_d0[uVar51 * 0xc + -1] = fStack_4c4;
            local_d0[uVar51 * 0xc] = (float)((int)local_580 + 1);
            uVar51 = (ulong)((int)uVar51 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar51 == 0) {
        if (bVar52 != 0) {
          return local_6b9;
        }
        fVar154 = *(float *)(ray + k * 4 + 0x80);
        auVar136._4_4_ = -(uint)(fStack_1b4 <= fVar154);
        auVar136._0_4_ = -(uint)(local_1b8 <= fVar154);
        auVar136._8_4_ = -(uint)(fStack_1b0 <= fVar154);
        auVar136._12_4_ = -(uint)(fStack_1ac <= fVar154);
        uVar59 = movmskps((int)lVar50,auVar136);
        uVar59 = (uint)local_370 & uVar59;
        local_6b9 = uVar59 != 0;
        if (!local_6b9) {
          return local_6b9;
        }
        goto LAB_00b20336;
      }
      uVar49 = (ulong)((int)uVar51 - 1);
      fVar69 = *(float *)(ray + k * 4 + 0x80);
      auVar109._0_4_ =
           -(uint)(fVar185 + afStack_e8[uVar49 * 0xc] <= fVar69) & local_f8[uVar49 * 0xc];
      auVar109._4_4_ =
           -(uint)(fVar196 + afStack_e8[uVar49 * 0xc + 1] <= fVar69) & local_f8[uVar49 * 0xc + 1];
      auVar109._8_4_ =
           -(uint)(fVar197 + afStack_e8[uVar49 * 0xc + 2] <= fVar69) & local_f8[uVar49 * 0xc + 2];
      auVar109._12_4_ =
           -(uint)(fVar198 + afStack_e8[uVar49 * 0xc + 3] <= fVar69) &
           (uint)afStack_e8[uVar49 * 0xc + -1];
      _local_268 = auVar109;
      iVar45 = movmskps((int)lVar50,auVar109);
      lVar50 = CONCAT44((int)((ulong)lVar50 >> 0x20),iVar45);
      if (iVar45 != 0) {
        auVar133._0_4_ = (uint)afStack_e8[uVar49 * 0xc] & auVar109._0_4_;
        auVar133._4_4_ = (uint)afStack_e8[uVar49 * 0xc + 1] & auVar109._4_4_;
        auVar133._8_4_ = (uint)afStack_e8[uVar49 * 0xc + 2] & auVar109._8_4_;
        auVar133._12_4_ = (uint)afStack_e8[uVar49 * 0xc + 3] & auVar109._12_4_;
        auVar152._0_8_ = CONCAT44(~auVar109._4_4_,~auVar109._0_4_) & 0x7f8000007f800000;
        auVar152._8_4_ = ~auVar109._8_4_ & 0x7f800000;
        auVar152._12_4_ = ~auVar109._12_4_ & 0x7f800000;
        auVar152 = auVar152 | auVar133;
        auVar167._4_4_ = auVar152._0_4_;
        auVar167._0_4_ = auVar152._4_4_;
        auVar167._8_4_ = auVar152._12_4_;
        auVar167._12_4_ = auVar152._8_4_;
        auVar77 = minps(auVar167,auVar152);
        auVar134._0_8_ = auVar77._8_8_;
        auVar134._8_4_ = auVar77._0_4_;
        auVar134._12_4_ = auVar77._4_4_;
        auVar77 = minps(auVar134,auVar77);
        auVar135._0_8_ =
             CONCAT44(-(uint)(auVar77._4_4_ == auVar152._4_4_) & auVar109._4_4_,
                      -(uint)(auVar77._0_4_ == auVar152._0_4_) & auVar109._0_4_);
        auVar135._8_4_ = -(uint)(auVar77._8_4_ == auVar152._8_4_) & auVar109._8_4_;
        auVar135._12_4_ = -(uint)(auVar77._12_4_ == auVar152._12_4_) & auVar109._12_4_;
        iVar53 = movmskps((int)lVar55,auVar135);
        if (iVar53 != 0) {
          auVar109._8_4_ = auVar135._8_4_;
          auVar109._0_8_ = auVar135._0_8_;
          auVar109._12_4_ = auVar135._12_4_;
        }
        fVar69 = local_d0[uVar49 * 0xc + -2];
        fVar137 = local_d0[uVar49 * 0xc + -1];
        uVar54 = movmskps(iVar53,auVar109);
        uVar56 = CONCAT44((int)((ulong)lVar55 >> 0x20),uVar54);
        lVar55 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
          }
        }
        *(undefined4 *)(local_268 + lVar55 * 4) = 0;
        iVar53 = movmskps((int)pRVar57,_local_268);
        pRVar57 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d0[uVar49 * 0xc];
        if (iVar53 == 0) {
          uVar51 = uVar49;
        }
        *(undefined1 (*) [16])(local_f8 + uVar49 * 0xc) = _local_268;
        fVar137 = fVar137 - fVar69;
        _local_528 = (int *)CONCAT44(fVar137 * 0.33333334 + fVar69,fVar137 * 0.0 + fVar69);
        uStack_520 = (void *)CONCAT44(fVar137 * 1.0 + fVar69,fVar137 * 0.6666667 + fVar69);
        local_4c8 = *(float *)(local_528 + lVar55 * 4);
        fStack_4c4 = *(float *)(local_528 + lVar55 * 4 + 4);
        uStack_4c0 = 0;
        uStack_4bc = 0;
        uVar49 = uVar51;
        local_580 = pRVar57;
      }
      uVar51 = uVar49;
    } while ((char)iVar45 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }